

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  bool bVar75;
  long lVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  ulong uVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  long lVar97;
  ulong uVar98;
  bool bVar99;
  float fVar100;
  float fVar128;
  float fVar131;
  __m128 a;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar137;
  float fVar139;
  float fVar141;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar145;
  float fVar183;
  float fVar184;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar186;
  undefined1 auVar167 [32];
  float fVar185;
  float fVar187;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar155 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar231;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar235;
  float fVar251;
  float fVar252;
  float fVar254;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar253;
  float fVar255;
  float fVar258;
  float fVar261;
  float fVar264;
  undefined1 auVar245 [28];
  float fVar257;
  float fVar260;
  float fVar263;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar256;
  float fVar259;
  float fVar262;
  undefined1 auVar250 [64];
  float fVar265;
  float fVar266;
  float fVar284;
  float fVar286;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar274 [32];
  float fVar288;
  undefined1 auVar275 [32];
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar296;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar299 [16];
  float fVar297;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar312;
  float fVar314;
  float fVar318;
  float fVar320;
  float fVar322;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar316;
  undefined1 auVar305 [32];
  float fVar298;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  float fVar324;
  undefined1 auVar325 [16];
  float fVar339;
  float fVar340;
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar342;
  undefined1 auVar333 [32];
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar350;
  undefined1 auVar351 [16];
  float fVar356;
  float fVar357;
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar358;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [28];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar369;
  undefined1 auVar368 [32];
  float fVar370;
  undefined1 auVar371 [16];
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  float fVar380;
  undefined1 auVar381 [16];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar387;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar388;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float in_register_0000151c;
  undefined1 auVar389 [32];
  float fVar398;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar399;
  float fVar400;
  float fVar406;
  float fVar409;
  float fVar411;
  float fVar413;
  float fVar415;
  float fVar417;
  undefined1 auVar402 [32];
  float fVar407;
  float fVar410;
  float fVar412;
  float fVar414;
  float fVar416;
  float fVar418;
  float fVar419;
  undefined1 auVar403 [32];
  float fVar401;
  float fVar408;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float in_register_0000159c;
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar424;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float in_register_000015dc;
  undefined1 auVar425 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_bc0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 *local_9f0;
  Primitive *local_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar386 [64];
  
  PVar7 = prim[1];
  uVar95 = (ulong)(byte)PVar7;
  lVar97 = uVar95 * 5;
  lVar76 = uVar95 * 0x19;
  auVar148 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar214 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar208 = *(float *)(prim + lVar76 + 0x12);
  auVar148 = vsubps_avx(auVar148,*(undefined1 (*) [16])(prim + lVar76 + 6));
  auVar146._0_4_ = fVar208 * auVar148._0_4_;
  auVar146._4_4_ = fVar208 * auVar148._4_4_;
  auVar146._8_4_ = fVar208 * auVar148._8_4_;
  auVar146._12_4_ = fVar208 * auVar148._12_4_;
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar325 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 10)));
  auVar267._0_4_ = fVar208 * auVar214._0_4_;
  auVar267._4_4_ = fVar208 * auVar214._4_4_;
  auVar267._8_4_ = fVar208 * auVar214._8_4_;
  auVar267._12_4_ = fVar208 * auVar214._12_4_;
  auVar114._16_16_ = auVar325;
  auVar114._0_16_ = auVar148;
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + 10)));
  auVar199._16_16_ = auVar214;
  auVar199._0_16_ = auVar148;
  auVar354 = vcvtdq2ps_avx(auVar199);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 10)));
  auVar219._16_16_ = auVar214;
  auVar219._0_16_ = auVar148;
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 10)));
  auVar14 = vcvtdq2ps_avx(auVar219);
  auVar220._16_16_ = auVar214;
  auVar220._0_16_ = auVar148;
  auVar15 = vcvtdq2ps_avx(auVar220);
  uVar93 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar302._16_16_ = auVar214;
  auVar302._0_16_ = auVar148;
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar302);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 10)));
  auVar326._16_16_ = auVar214;
  auVar326._0_16_ = auVar148;
  lVar12 = uVar95 * 9;
  uVar93 = (ulong)(uint)((int)lVar12 * 2);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar405 = vcvtdq2ps_avx(auVar326);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar327._16_16_ = auVar214;
  auVar327._0_16_ = auVar148;
  auVar17 = vcvtdq2ps_avx(auVar327);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 10)));
  auVar365._16_16_ = auVar214;
  auVar365._0_16_ = auVar148;
  uVar93 = (ulong)(uint)((int)lVar97 << 2);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar308 = vcvtdq2ps_avx(auVar365);
  auVar372._16_16_ = auVar214;
  auVar372._0_16_ = auVar148;
  auVar18 = vcvtdq2ps_avx(auVar372);
  auVar148 = vshufps_avx(auVar267,auVar267,0);
  auVar214 = vshufps_avx(auVar267,auVar267,0x55);
  auVar325 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar208 = auVar325._0_4_;
  fVar229 = auVar325._4_4_;
  fVar230 = auVar325._8_4_;
  fVar231 = auVar325._12_4_;
  fVar232 = auVar214._0_4_;
  fVar233 = auVar214._4_4_;
  fVar234 = auVar214._8_4_;
  fVar235 = auVar214._12_4_;
  fVar251 = auVar148._0_4_;
  fVar252 = auVar148._4_4_;
  fVar254 = auVar148._8_4_;
  fVar256 = auVar148._12_4_;
  auVar389._0_4_ = fVar251 * auVar114._0_4_ + fVar232 * auVar354._0_4_ + fVar208 * auVar14._0_4_;
  auVar389._4_4_ = fVar252 * auVar114._4_4_ + fVar233 * auVar354._4_4_ + fVar229 * auVar14._4_4_;
  auVar389._8_4_ = fVar254 * auVar114._8_4_ + fVar234 * auVar354._8_4_ + fVar230 * auVar14._8_4_;
  auVar389._12_4_ = fVar256 * auVar114._12_4_ + fVar235 * auVar354._12_4_ + fVar231 * auVar14._12_4_
  ;
  auVar389._16_4_ = fVar251 * auVar114._16_4_ + fVar232 * auVar354._16_4_ + fVar208 * auVar14._16_4_
  ;
  auVar389._20_4_ = fVar252 * auVar114._20_4_ + fVar233 * auVar354._20_4_ + fVar229 * auVar14._20_4_
  ;
  auVar389._24_4_ = fVar254 * auVar114._24_4_ + fVar234 * auVar354._24_4_ + fVar230 * auVar14._24_4_
  ;
  auVar389._28_4_ = fVar235 + in_register_000015dc + in_register_0000151c;
  auVar382._0_4_ = fVar251 * auVar15._0_4_ + fVar232 * auVar16._0_4_ + auVar405._0_4_ * fVar208;
  auVar382._4_4_ = fVar252 * auVar15._4_4_ + fVar233 * auVar16._4_4_ + auVar405._4_4_ * fVar229;
  auVar382._8_4_ = fVar254 * auVar15._8_4_ + fVar234 * auVar16._8_4_ + auVar405._8_4_ * fVar230;
  auVar382._12_4_ = fVar256 * auVar15._12_4_ + fVar235 * auVar16._12_4_ + auVar405._12_4_ * fVar231;
  auVar382._16_4_ = fVar251 * auVar15._16_4_ + fVar232 * auVar16._16_4_ + auVar405._16_4_ * fVar208;
  auVar382._20_4_ = fVar252 * auVar15._20_4_ + fVar233 * auVar16._20_4_ + auVar405._20_4_ * fVar229;
  auVar382._24_4_ = fVar254 * auVar15._24_4_ + fVar234 * auVar16._24_4_ + auVar405._24_4_ * fVar230;
  auVar382._28_4_ = fVar235 + in_register_000015dc + in_register_0000159c;
  auVar274._0_4_ = fVar251 * auVar17._0_4_ + fVar232 * auVar308._0_4_ + auVar18._0_4_ * fVar208;
  auVar274._4_4_ = fVar252 * auVar17._4_4_ + fVar233 * auVar308._4_4_ + auVar18._4_4_ * fVar229;
  auVar274._8_4_ = fVar254 * auVar17._8_4_ + fVar234 * auVar308._8_4_ + auVar18._8_4_ * fVar230;
  auVar274._12_4_ = fVar256 * auVar17._12_4_ + fVar235 * auVar308._12_4_ + auVar18._12_4_ * fVar231;
  auVar274._16_4_ = fVar251 * auVar17._16_4_ + fVar232 * auVar308._16_4_ + auVar18._16_4_ * fVar208;
  auVar274._20_4_ = fVar252 * auVar17._20_4_ + fVar233 * auVar308._20_4_ + auVar18._20_4_ * fVar229;
  auVar274._24_4_ = fVar254 * auVar17._24_4_ + fVar234 * auVar308._24_4_ + auVar18._24_4_ * fVar230;
  auVar274._28_4_ = fVar256 + fVar235 + fVar231;
  auVar148 = vshufps_avx(auVar146,auVar146,0);
  auVar214 = vshufps_avx(auVar146,auVar146,0x55);
  auVar325 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar229 = auVar325._0_4_;
  fVar230 = auVar325._4_4_;
  fVar231 = auVar325._8_4_;
  fVar232 = auVar325._12_4_;
  fVar252 = auVar214._0_4_;
  fVar254 = auVar214._4_4_;
  fVar256 = auVar214._8_4_;
  fVar259 = auVar214._12_4_;
  fVar233 = auVar148._0_4_;
  fVar234 = auVar148._4_4_;
  fVar235 = auVar148._8_4_;
  fVar251 = auVar148._12_4_;
  fVar208 = auVar114._28_4_;
  auVar303._0_4_ = fVar233 * auVar114._0_4_ + fVar252 * auVar354._0_4_ + fVar229 * auVar14._0_4_;
  auVar303._4_4_ = fVar234 * auVar114._4_4_ + fVar254 * auVar354._4_4_ + fVar230 * auVar14._4_4_;
  auVar303._8_4_ = fVar235 * auVar114._8_4_ + fVar256 * auVar354._8_4_ + fVar231 * auVar14._8_4_;
  auVar303._12_4_ = fVar251 * auVar114._12_4_ + fVar259 * auVar354._12_4_ + fVar232 * auVar14._12_4_
  ;
  auVar303._16_4_ = fVar233 * auVar114._16_4_ + fVar252 * auVar354._16_4_ + fVar229 * auVar14._16_4_
  ;
  auVar303._20_4_ = fVar234 * auVar114._20_4_ + fVar254 * auVar354._20_4_ + fVar230 * auVar14._20_4_
  ;
  auVar303._24_4_ = fVar235 * auVar114._24_4_ + fVar256 * auVar354._24_4_ + fVar231 * auVar14._24_4_
  ;
  auVar303._28_4_ = fVar208 + auVar354._28_4_ + auVar14._28_4_;
  auVar163._0_4_ = fVar233 * auVar15._0_4_ + auVar405._0_4_ * fVar229 + fVar252 * auVar16._0_4_;
  auVar163._4_4_ = fVar234 * auVar15._4_4_ + auVar405._4_4_ * fVar230 + fVar254 * auVar16._4_4_;
  auVar163._8_4_ = fVar235 * auVar15._8_4_ + auVar405._8_4_ * fVar231 + fVar256 * auVar16._8_4_;
  auVar163._12_4_ = fVar251 * auVar15._12_4_ + auVar405._12_4_ * fVar232 + fVar259 * auVar16._12_4_;
  auVar163._16_4_ = fVar233 * auVar15._16_4_ + auVar405._16_4_ * fVar229 + fVar252 * auVar16._16_4_;
  auVar163._20_4_ = fVar234 * auVar15._20_4_ + auVar405._20_4_ * fVar230 + fVar254 * auVar16._20_4_;
  auVar163._24_4_ = fVar235 * auVar15._24_4_ + auVar405._24_4_ * fVar231 + fVar256 * auVar16._24_4_;
  auVar163._28_4_ = fVar208 + auVar405._28_4_ + auVar14._28_4_;
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar328._16_4_ = 0x7fffffff;
  auVar328._20_4_ = 0x7fffffff;
  auVar328._24_4_ = 0x7fffffff;
  auVar328._28_4_ = 0x7fffffff;
  auVar366._8_4_ = 0x219392ef;
  auVar366._0_8_ = 0x219392ef219392ef;
  auVar366._12_4_ = 0x219392ef;
  auVar366._16_4_ = 0x219392ef;
  auVar366._20_4_ = 0x219392ef;
  auVar366._24_4_ = 0x219392ef;
  auVar366._28_4_ = 0x219392ef;
  auVar114 = vandps_avx(auVar389,auVar328);
  auVar114 = vcmpps_avx(auVar114,auVar366,1);
  auVar354 = vblendvps_avx(auVar389,auVar366,auVar114);
  auVar114 = vandps_avx(auVar382,auVar328);
  auVar114 = vcmpps_avx(auVar114,auVar366,1);
  auVar14 = vblendvps_avx(auVar382,auVar366,auVar114);
  auVar114 = vandps_avx(auVar274,auVar328);
  auVar114 = vcmpps_avx(auVar114,auVar366,1);
  auVar114 = vblendvps_avx(auVar274,auVar366,auVar114);
  auVar200._0_4_ = fVar252 * auVar308._0_4_ + auVar18._0_4_ * fVar229 + fVar233 * auVar17._0_4_;
  auVar200._4_4_ = fVar254 * auVar308._4_4_ + auVar18._4_4_ * fVar230 + fVar234 * auVar17._4_4_;
  auVar200._8_4_ = fVar256 * auVar308._8_4_ + auVar18._8_4_ * fVar231 + fVar235 * auVar17._8_4_;
  auVar200._12_4_ = fVar259 * auVar308._12_4_ + auVar18._12_4_ * fVar232 + fVar251 * auVar17._12_4_;
  auVar200._16_4_ = fVar252 * auVar308._16_4_ + auVar18._16_4_ * fVar229 + fVar233 * auVar17._16_4_;
  auVar200._20_4_ = fVar254 * auVar308._20_4_ + auVar18._20_4_ * fVar230 + fVar234 * auVar17._20_4_;
  auVar200._24_4_ = fVar256 * auVar308._24_4_ + auVar18._24_4_ * fVar231 + fVar235 * auVar17._24_4_;
  auVar200._28_4_ = auVar16._28_4_ + fVar232 + fVar208;
  auVar15 = vrcpps_avx(auVar354);
  fVar208 = auVar15._0_4_;
  fVar229 = auVar15._4_4_;
  auVar16._4_4_ = auVar354._4_4_ * fVar229;
  auVar16._0_4_ = auVar354._0_4_ * fVar208;
  fVar230 = auVar15._8_4_;
  auVar16._8_4_ = auVar354._8_4_ * fVar230;
  fVar231 = auVar15._12_4_;
  auVar16._12_4_ = auVar354._12_4_ * fVar231;
  fVar232 = auVar15._16_4_;
  auVar16._16_4_ = auVar354._16_4_ * fVar232;
  fVar233 = auVar15._20_4_;
  auVar16._20_4_ = auVar354._20_4_ * fVar233;
  fVar234 = auVar15._24_4_;
  auVar16._24_4_ = auVar354._24_4_ * fVar234;
  auVar16._28_4_ = auVar354._28_4_;
  auVar352._8_4_ = 0x3f800000;
  auVar352._0_8_ = &DAT_3f8000003f800000;
  auVar352._12_4_ = 0x3f800000;
  auVar352._16_4_ = 0x3f800000;
  auVar352._20_4_ = 0x3f800000;
  auVar352._24_4_ = 0x3f800000;
  auVar352._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar352,auVar16);
  auVar354 = vrcpps_avx(auVar14);
  fVar208 = fVar208 + fVar208 * auVar16._0_4_;
  fVar229 = fVar229 + fVar229 * auVar16._4_4_;
  fVar230 = fVar230 + fVar230 * auVar16._8_4_;
  fVar231 = fVar231 + fVar231 * auVar16._12_4_;
  fVar232 = fVar232 + fVar232 * auVar16._16_4_;
  fVar233 = fVar233 + fVar233 * auVar16._20_4_;
  fVar234 = fVar234 + fVar234 * auVar16._24_4_;
  fVar265 = auVar354._0_4_;
  fVar284 = auVar354._4_4_;
  auVar405._4_4_ = fVar284 * auVar14._4_4_;
  auVar405._0_4_ = fVar265 * auVar14._0_4_;
  fVar286 = auVar354._8_4_;
  auVar405._8_4_ = fVar286 * auVar14._8_4_;
  fVar288 = auVar354._12_4_;
  auVar405._12_4_ = fVar288 * auVar14._12_4_;
  fVar290 = auVar354._16_4_;
  auVar405._16_4_ = fVar290 * auVar14._16_4_;
  fVar292 = auVar354._20_4_;
  auVar405._20_4_ = fVar292 * auVar14._20_4_;
  fVar294 = auVar354._24_4_;
  auVar405._24_4_ = fVar294 * auVar14._24_4_;
  auVar405._28_4_ = auVar15._28_4_;
  auVar354 = vsubps_avx(auVar352,auVar405);
  fVar265 = fVar265 + fVar265 * auVar354._0_4_;
  fVar284 = fVar284 + fVar284 * auVar354._4_4_;
  fVar286 = fVar286 + fVar286 * auVar354._8_4_;
  fVar288 = fVar288 + fVar288 * auVar354._12_4_;
  fVar290 = fVar290 + fVar290 * auVar354._16_4_;
  fVar292 = fVar292 + fVar292 * auVar354._20_4_;
  fVar294 = fVar294 + fVar294 * auVar354._24_4_;
  auVar354 = vrcpps_avx(auVar114);
  fVar235 = auVar354._0_4_;
  fVar251 = auVar354._4_4_;
  auVar17._4_4_ = fVar251 * auVar114._4_4_;
  auVar17._0_4_ = fVar235 * auVar114._0_4_;
  fVar252 = auVar354._8_4_;
  auVar17._8_4_ = fVar252 * auVar114._8_4_;
  fVar254 = auVar354._12_4_;
  auVar17._12_4_ = fVar254 * auVar114._12_4_;
  fVar256 = auVar354._16_4_;
  auVar17._16_4_ = fVar256 * auVar114._16_4_;
  fVar259 = auVar354._20_4_;
  auVar17._20_4_ = fVar259 * auVar114._20_4_;
  fVar262 = auVar354._24_4_;
  auVar17._24_4_ = fVar262 * auVar114._24_4_;
  auVar17._28_4_ = auVar14._28_4_;
  auVar114 = vsubps_avx(auVar352,auVar17);
  fVar235 = fVar235 + fVar235 * auVar114._0_4_;
  fVar251 = fVar251 + fVar251 * auVar114._4_4_;
  fVar252 = fVar252 + fVar252 * auVar114._8_4_;
  fVar254 = fVar254 + fVar254 * auVar114._12_4_;
  fVar256 = fVar256 + fVar256 * auVar114._16_4_;
  fVar259 = fVar259 + fVar259 * auVar114._20_4_;
  fVar262 = fVar262 + fVar262 * auVar114._24_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar148 = vpmovsxwd_avx(auVar148);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar95 * 7 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar115._16_16_ = auVar214;
  auVar115._0_16_ = auVar148;
  auVar114 = vcvtdq2ps_avx(auVar115);
  auVar114 = vsubps_avx(auVar114,auVar303);
  auVar103._0_4_ = fVar208 * auVar114._0_4_;
  auVar103._4_4_ = fVar229 * auVar114._4_4_;
  auVar103._8_4_ = fVar230 * auVar114._8_4_;
  auVar103._12_4_ = fVar231 * auVar114._12_4_;
  auVar14._16_4_ = fVar232 * auVar114._16_4_;
  auVar14._0_16_ = auVar103;
  auVar14._20_4_ = fVar233 * auVar114._20_4_;
  auVar14._24_4_ = fVar234 * auVar114._24_4_;
  auVar14._28_4_ = auVar114._28_4_;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar148 = vpmovsxwd_avx(auVar325);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar106);
  auVar329._16_16_ = auVar214;
  auVar329._0_16_ = auVar148;
  auVar114 = vcvtdq2ps_avx(auVar329);
  auVar114 = vsubps_avx(auVar114,auVar303);
  auVar209._0_4_ = fVar208 * auVar114._0_4_;
  auVar209._4_4_ = fVar229 * auVar114._4_4_;
  auVar209._8_4_ = fVar230 * auVar114._8_4_;
  auVar209._12_4_ = fVar231 * auVar114._12_4_;
  auVar308._16_4_ = fVar232 * auVar114._16_4_;
  auVar308._0_16_ = auVar209;
  auVar308._20_4_ = fVar233 * auVar114._20_4_;
  auVar308._24_4_ = fVar234 * auVar114._24_4_;
  auVar308._28_4_ = auVar15._28_4_ + auVar16._28_4_;
  lVar97 = (ulong)(byte)PVar7 * 0x10;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + lVar97 + 6);
  auVar148 = vpmovsxwd_avx(auVar192);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + lVar97 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar211);
  lVar97 = lVar97 + uVar95 * -2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar97 + 6);
  auVar325 = vpmovsxwd_avx(auVar3);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + lVar97 + 0xe);
  auVar106 = vpmovsxwd_avx(auVar152);
  auVar304._16_16_ = auVar106;
  auVar304._0_16_ = auVar325;
  auVar114 = vcvtdq2ps_avx(auVar304);
  auVar114 = vsubps_avx(auVar114,auVar163);
  auVar299._0_4_ = fVar265 * auVar114._0_4_;
  auVar299._4_4_ = fVar284 * auVar114._4_4_;
  auVar299._8_4_ = fVar286 * auVar114._8_4_;
  auVar299._12_4_ = fVar288 * auVar114._12_4_;
  auVar15._16_4_ = fVar290 * auVar114._16_4_;
  auVar15._0_16_ = auVar299;
  auVar15._20_4_ = fVar292 * auVar114._20_4_;
  auVar15._24_4_ = fVar294 * auVar114._24_4_;
  auVar15._28_4_ = auVar114._28_4_;
  auVar330._16_16_ = auVar214;
  auVar330._0_16_ = auVar148;
  auVar114 = vcvtdq2ps_avx(auVar330);
  auVar114 = vsubps_avx(auVar114,auVar163);
  auVar147._0_4_ = fVar265 * auVar114._0_4_;
  auVar147._4_4_ = fVar284 * auVar114._4_4_;
  auVar147._8_4_ = fVar286 * auVar114._8_4_;
  auVar147._12_4_ = fVar288 * auVar114._12_4_;
  auVar18._16_4_ = fVar290 * auVar114._16_4_;
  auVar18._0_16_ = auVar147;
  auVar18._20_4_ = fVar292 * auVar114._20_4_;
  auVar18._24_4_ = fVar294 * auVar114._24_4_;
  auVar18._28_4_ = auVar114._28_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 6);
  auVar148 = vpmovsxwd_avx(auVar159);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar4);
  auVar275._16_16_ = auVar214;
  auVar275._0_16_ = auVar148;
  auVar114 = vcvtdq2ps_avx(auVar275);
  auVar114 = vsubps_avx(auVar114,auVar200);
  auVar268._0_4_ = fVar235 * auVar114._0_4_;
  auVar268._4_4_ = fVar251 * auVar114._4_4_;
  auVar268._8_4_ = fVar252 * auVar114._8_4_;
  auVar268._12_4_ = fVar254 * auVar114._12_4_;
  auVar24._16_4_ = fVar256 * auVar114._16_4_;
  auVar24._0_16_ = auVar268;
  auVar24._20_4_ = fVar259 * auVar114._20_4_;
  auVar24._24_4_ = fVar262 * auVar114._24_4_;
  auVar24._28_4_ = auVar114._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 6);
  auVar148 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar6);
  auVar331._16_16_ = auVar214;
  auVar331._0_16_ = auVar148;
  auVar114 = vcvtdq2ps_avx(auVar331);
  auVar114 = vsubps_avx(auVar114,auVar200);
  auVar191._0_4_ = fVar235 * auVar114._0_4_;
  auVar191._4_4_ = fVar251 * auVar114._4_4_;
  auVar191._8_4_ = fVar252 * auVar114._8_4_;
  auVar191._12_4_ = fVar254 * auVar114._12_4_;
  auVar25._16_4_ = fVar256 * auVar114._16_4_;
  auVar25._0_16_ = auVar191;
  auVar25._20_4_ = fVar259 * auVar114._20_4_;
  auVar25._24_4_ = fVar262 * auVar114._24_4_;
  auVar25._28_4_ = auVar114._28_4_;
  auVar148 = vpminsd_avx(auVar14._16_16_,auVar308._16_16_);
  auVar214 = vpminsd_avx(auVar103,auVar209);
  auVar353._16_16_ = auVar148;
  auVar353._0_16_ = auVar214;
  auVar148 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar214 = vpminsd_avx(auVar299,auVar147);
  auVar383._16_16_ = auVar148;
  auVar383._0_16_ = auVar214;
  auVar114 = vmaxps_avx(auVar353,auVar383);
  auVar148 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar214 = vpminsd_avx(auVar268,auVar191);
  auVar402._16_16_ = auVar148;
  auVar402._0_16_ = auVar214;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar420._4_4_ = uVar1;
  auVar420._0_4_ = uVar1;
  auVar420._8_4_ = uVar1;
  auVar420._12_4_ = uVar1;
  auVar420._16_4_ = uVar1;
  auVar420._20_4_ = uVar1;
  auVar420._24_4_ = uVar1;
  auVar420._28_4_ = uVar1;
  auVar354 = vmaxps_avx(auVar402,auVar420);
  auVar114 = vmaxps_avx(auVar114,auVar354);
  local_3e0._4_4_ = auVar114._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar114._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar114._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar114._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar114._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar114._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar114._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar114._28_4_;
  auVar148 = vpmaxsd_avx(auVar14._16_16_,auVar308._16_16_);
  auVar214 = vpmaxsd_avx(auVar103,auVar209);
  auVar116._16_16_ = auVar148;
  auVar116._0_16_ = auVar214;
  auVar148 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar214 = vpmaxsd_avx(auVar299,auVar147);
  auVar164._16_16_ = auVar148;
  auVar164._0_16_ = auVar214;
  auVar114 = vminps_avx(auVar116,auVar164);
  auVar148 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar214 = vpmaxsd_avx(auVar268,auVar191);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar221._4_4_ = uVar1;
  auVar221._0_4_ = uVar1;
  auVar221._8_4_ = uVar1;
  auVar221._12_4_ = uVar1;
  auVar221._16_4_ = uVar1;
  auVar221._20_4_ = uVar1;
  auVar221._24_4_ = uVar1;
  auVar221._28_4_ = uVar1;
  auVar165._16_16_ = auVar148;
  auVar165._0_16_ = auVar214;
  auVar354 = vminps_avx(auVar165,auVar221);
  auVar114 = vminps_avx(auVar114,auVar354);
  auVar354._4_4_ = auVar114._4_4_ * 1.0000004;
  auVar354._0_4_ = auVar114._0_4_ * 1.0000004;
  auVar354._8_4_ = auVar114._8_4_ * 1.0000004;
  auVar354._12_4_ = auVar114._12_4_ * 1.0000004;
  auVar354._16_4_ = auVar114._16_4_ * 1.0000004;
  auVar354._20_4_ = auVar114._20_4_ * 1.0000004;
  auVar354._24_4_ = auVar114._24_4_ * 1.0000004;
  auVar354._28_4_ = auVar114._28_4_;
  auVar114 = vcmpps_avx(local_3e0,auVar354,2);
  auVar148 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar166._16_16_ = auVar148;
  auVar166._0_16_ = auVar148;
  auVar354 = vcvtdq2ps_avx(auVar166);
  auVar354 = vcmpps_avx(_DAT_02020f40,auVar354,1);
  auVar114 = vandps_avx(auVar114,auVar354);
  uVar94 = vmovmskps_avx(auVar114);
  if (uVar94 == 0) {
    return;
  }
  uVar94 = uVar94 & 0xff;
  local_8b0 = prim + lVar76 + 0x16;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_4c0 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_9f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_9e8 = prim;
LAB_010be2dd:
  local_8a8 = (ulong)uVar94;
  lVar97 = 0;
  if (local_8a8 != 0) {
    for (; (uVar94 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
    }
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  uVar94 = *(uint *)(local_9e8 + lVar97 * 4 + 6);
  lVar97 = lVar97 * 0x40;
  lVar12 = 0;
  if (local_8a8 != 0) {
    for (; (local_8a8 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar8 = *(uint *)(local_9e8 + 2);
  auVar148 = *(undefined1 (*) [16])(local_8b0 + lVar97);
  if (((local_8a8 != 0) && (uVar95 = local_8a8 - 1 & local_8a8, uVar95 != 0)) &&
     (lVar12 = 0, uVar95 != 0)) {
    for (; (uVar95 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar214 = *(undefined1 (*) [16])(local_8b0 + lVar97 + 0x10);
  auVar325 = *(undefined1 (*) [16])(local_8b0 + lVar97 + 0x20);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar211 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar208 = *(float *)(ray + k * 4 + 0x40);
  auVar362._4_4_ = fVar208;
  auVar362._0_4_ = fVar208;
  auVar362._8_4_ = fVar208;
  auVar362._12_4_ = fVar208;
  fStack_7b0 = fVar208;
  _local_7c0 = auVar362;
  fStack_7ac = fVar208;
  fStack_7a8 = fVar208;
  fStack_7a4 = fVar208;
  auVar106 = *(undefined1 (*) [16])(local_8b0 + lVar97 + 0x30);
  fVar229 = *(float *)(ray + k * 4 + 0x50);
  auVar371._4_4_ = fVar229;
  auVar371._0_4_ = fVar229;
  auVar371._8_4_ = fVar229;
  auVar371._12_4_ = fVar229;
  fStack_7d0 = fVar229;
  _local_7e0 = auVar371;
  fStack_7cc = fVar229;
  fStack_7c8 = fVar229;
  fStack_7c4 = fVar229;
  auVar192 = vunpcklps_avx(auVar362,auVar371);
  fVar230 = *(float *)(ray + k * 4 + 0x60);
  auVar381._4_4_ = fVar230;
  auVar381._0_4_ = fVar230;
  auVar381._8_4_ = fVar230;
  auVar381._12_4_ = fVar230;
  fStack_7f0 = fVar230;
  _local_800 = auVar381;
  fStack_7ec = fVar230;
  fStack_7e8 = fVar230;
  fStack_7e4 = fVar230;
  auVar386 = ZEXT3264(_local_800);
  _local_930 = vinsertps_avx(auVar192,auVar381,0x28);
  auVar104._0_4_ = (auVar148._0_4_ + auVar214._0_4_ + auVar325._0_4_ + auVar106._0_4_) * 0.25;
  auVar104._4_4_ = (auVar148._4_4_ + auVar214._4_4_ + auVar325._4_4_ + auVar106._4_4_) * 0.25;
  auVar104._8_4_ = (auVar148._8_4_ + auVar214._8_4_ + auVar325._8_4_ + auVar106._8_4_) * 0.25;
  auVar104._12_4_ = (auVar148._12_4_ + auVar214._12_4_ + auVar325._12_4_ + auVar106._12_4_) * 0.25;
  auVar192 = vsubps_avx(auVar104,auVar211);
  auVar192 = vdpps_avx(auVar192,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar3 = vrcpss_avx(local_940,local_940);
  fVar231 = auVar192._0_4_ * auVar3._0_4_ * (2.0 - local_940._0_4_ * auVar3._0_4_);
  auVar3 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
  auVar236._0_4_ = auVar211._0_4_ + local_930._0_4_ * auVar3._0_4_;
  auVar236._4_4_ = auVar211._4_4_ + local_930._4_4_ * auVar3._4_4_;
  auVar236._8_4_ = auVar211._8_4_ + local_930._8_4_ * auVar3._8_4_;
  auVar236._12_4_ = auVar211._12_4_ + local_930._12_4_ * auVar3._12_4_;
  auVar192 = vblendps_avx(auVar236,_DAT_01feba10,8);
  _local_a80 = vsubps_avx(auVar148,auVar192);
  _local_a90 = vsubps_avx(auVar325,auVar192);
  auVar228 = ZEXT1664(_local_a90);
  _local_aa0 = vsubps_avx(auVar214,auVar192);
  _local_ab0 = vsubps_avx(auVar106,auVar192);
  auVar148 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001250 = auVar148;
  _local_1a0 = auVar148;
  auVar148 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001250 = auVar148;
  _local_1c0 = auVar148;
  auVar148 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001250 = auVar148;
  _local_1e0 = auVar148;
  auVar148 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar148;
  _local_200 = auVar148;
  auVar148 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001290 = auVar148;
  _local_220 = auVar148;
  auVar148 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001290 = auVar148;
  _local_240 = auVar148;
  auVar148 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001290 = auVar148;
  _local_260 = auVar148;
  auVar148 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar148;
  _local_280 = auVar148;
  auVar148 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar148;
  _local_2a0 = auVar148;
  auVar148 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar148;
  _local_2c0 = auVar148;
  auVar148 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar148;
  _local_2e0 = auVar148;
  auVar148 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar148;
  _local_300 = auVar148;
  auVar148 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar148;
  _local_320 = auVar148;
  auVar148 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar148;
  _local_340 = auVar148;
  auVar148 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar148;
  _local_360 = auVar148;
  auVar148 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar148;
  _local_380 = auVar148;
  auVar148 = ZEXT416((uint)(fVar208 * fVar208 + fVar229 * fVar229 + fVar230 * fVar230));
  auVar148 = vshufps_avx(auVar148,auVar148,0);
  local_3a0._16_16_ = auVar148;
  local_3a0._0_16_ = auVar148;
  fVar208 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar231);
  auVar148 = vshufps_avx(ZEXT416((uint)(fVar208 - fVar231)),ZEXT416((uint)(fVar208 - fVar231)),0);
  local_3c0._16_16_ = auVar148;
  local_3c0._0_16_ = auVar148;
  local_710 = vshufps_avx(ZEXT416(uVar8),ZEXT416(uVar8),0);
  local_720 = vshufps_avx(ZEXT416(uVar94),ZEXT416(uVar94),0);
  register0x00001390 = auVar3;
  _local_9a0 = auVar3;
  auVar311 = ZEXT3264(_local_9a0);
  uVar95 = 1;
  uVar93 = 0;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_3a0,auVar118);
  auVar148 = vsqrtss_avx(local_940,local_940);
  local_b04 = auVar148._0_4_;
  auVar148 = vsqrtss_avx(local_940,local_940);
  local_b08 = auVar148._0_4_;
  auVar338 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar325 = auVar338._0_16_;
    auVar148 = vmovshdup_avx(auVar325);
    fVar229 = auVar148._0_4_ - auVar338._0_4_;
    auVar148 = vshufps_avx(auVar325,auVar325,0);
    local_980._16_16_ = auVar148;
    local_980._0_16_ = auVar148;
    auVar214 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
    local_920._16_16_ = auVar214;
    local_920._0_16_ = auVar214;
    fVar145 = auVar214._0_4_;
    fVar183 = auVar214._4_4_;
    fVar184 = auVar214._8_4_;
    fVar186 = auVar214._12_4_;
    fVar100 = auVar148._0_4_;
    auVar167._0_4_ = fVar100 + fVar145 * 0.0;
    fVar128 = auVar148._4_4_;
    auVar167._4_4_ = fVar128 + fVar183 * 0.14285715;
    fVar131 = auVar148._8_4_;
    auVar167._8_4_ = fVar131 + fVar184 * 0.2857143;
    fVar134 = auVar148._12_4_;
    auVar167._12_4_ = fVar134 + fVar186 * 0.42857146;
    auVar167._16_4_ = fVar100 + fVar145 * 0.5714286;
    auVar167._20_4_ = fVar128 + fVar183 * 0.71428573;
    auVar167._24_4_ = fVar131 + fVar184 * 0.8571429;
    auVar167._28_4_ = fVar134 + fVar186;
    auVar114 = vsubps_avx(auVar250._0_32_,auVar167);
    fVar230 = auVar114._0_4_;
    fVar231 = auVar114._4_4_;
    fVar232 = auVar114._8_4_;
    fVar233 = auVar114._12_4_;
    fVar234 = auVar114._16_4_;
    fVar235 = auVar114._20_4_;
    fVar251 = auVar114._24_4_;
    fVar286 = auVar228._28_4_;
    fVar297 = (float)local_2a0._0_4_ * auVar167._0_4_ + (float)local_220._0_4_ * fVar230;
    fVar312 = (float)local_2a0._4_4_ * auVar167._4_4_ + (float)local_220._4_4_ * fVar231;
    fVar314 = fStack_298 * auVar167._8_4_ + fStack_218 * fVar232;
    fVar316 = fStack_294 * auVar167._12_4_ + fStack_214 * fVar233;
    fVar318 = fStack_290 * auVar167._16_4_ + fStack_210 * fVar234;
    fVar320 = fStack_28c * auVar167._20_4_ + fStack_20c * fVar235;
    fVar322 = fStack_288 * auVar167._24_4_ + fStack_208 * fVar251;
    fVar252 = (float)local_2c0._0_4_ * auVar167._0_4_ + (float)local_240._0_4_ * fVar230;
    fVar254 = (float)local_2c0._4_4_ * auVar167._4_4_ + (float)local_240._4_4_ * fVar231;
    fVar256 = fStack_2b8 * auVar167._8_4_ + fStack_238 * fVar232;
    fVar259 = fStack_2b4 * auVar167._12_4_ + fStack_234 * fVar233;
    fVar262 = fStack_2b0 * auVar167._16_4_ + fStack_230 * fVar234;
    fVar265 = fStack_2ac * auVar167._20_4_ + fStack_22c * fVar235;
    fVar284 = fStack_2a8 * auVar167._24_4_ + fStack_228 * fVar251;
    fVar288 = (float)local_2e0._0_4_ * auVar167._0_4_ + (float)local_260._0_4_ * fVar230;
    fVar290 = (float)local_2e0._4_4_ * auVar167._4_4_ + (float)local_260._4_4_ * fVar231;
    fVar292 = fStack_2d8 * auVar167._8_4_ + fStack_258 * fVar232;
    fVar294 = fStack_2d4 * auVar167._12_4_ + fStack_254 * fVar233;
    fVar257 = fStack_2d0 * auVar167._16_4_ + fStack_250 * fVar234;
    fVar260 = fStack_2cc * auVar167._20_4_ + fStack_24c * fVar235;
    fVar263 = fStack_2c8 * auVar167._24_4_ + fStack_248 * fVar251;
    fVar266 = (float)local_300._0_4_ * auVar167._0_4_ + (float)local_280._0_4_ * fVar230;
    fVar285 = (float)local_300._4_4_ * auVar167._4_4_ + (float)local_280._4_4_ * fVar231;
    fVar287 = fStack_2f8 * auVar167._8_4_ + fStack_278 * fVar232;
    fVar289 = fStack_2f4 * auVar167._12_4_ + fStack_274 * fVar233;
    fVar291 = fStack_2f0 * auVar167._16_4_ + fStack_270 * fVar234;
    fVar293 = fStack_2ec * auVar167._20_4_ + fStack_26c * fVar235;
    fVar295 = fStack_2e8 * auVar167._24_4_ + fStack_268 * fVar251;
    fVar387 = auVar386._28_4_;
    fVar419 = fVar387 + fStack_224;
    fVar398 = fStack_204 + fVar387;
    auVar367._0_4_ =
         ((float)local_220._0_4_ * auVar167._0_4_ + fVar230 * (float)local_1a0._0_4_) * fVar230 +
         auVar167._0_4_ * fVar297;
    auVar367._4_4_ =
         ((float)local_220._4_4_ * auVar167._4_4_ + fVar231 * (float)local_1a0._4_4_) * fVar231 +
         auVar167._4_4_ * fVar312;
    auVar367._8_4_ =
         (fStack_218 * auVar167._8_4_ + fVar232 * fStack_198) * fVar232 + auVar167._8_4_ * fVar314;
    auVar367._12_4_ =
         (fStack_214 * auVar167._12_4_ + fVar233 * fStack_194) * fVar233 + auVar167._12_4_ * fVar316
    ;
    auVar367._16_4_ =
         (fStack_210 * auVar167._16_4_ + fVar234 * fStack_190) * fVar234 + auVar167._16_4_ * fVar318
    ;
    auVar367._20_4_ =
         (fStack_20c * auVar167._20_4_ + fVar235 * fStack_18c) * fVar235 + auVar167._20_4_ * fVar320
    ;
    auVar367._24_4_ =
         (fStack_208 * auVar167._24_4_ + fVar251 * fStack_188) * fVar251 + auVar167._24_4_ * fVar322
    ;
    auVar367._28_4_ = fStack_2e4 + fVar387;
    auVar373._0_4_ =
         fVar230 * ((float)local_240._0_4_ * auVar167._0_4_ + fVar230 * (float)local_1c0._0_4_) +
         auVar167._0_4_ * fVar252;
    auVar373._4_4_ =
         fVar231 * ((float)local_240._4_4_ * auVar167._4_4_ + fVar231 * (float)local_1c0._4_4_) +
         auVar167._4_4_ * fVar254;
    auVar373._8_4_ =
         fVar232 * (fStack_238 * auVar167._8_4_ + fVar232 * fStack_1b8) + auVar167._8_4_ * fVar256;
    auVar373._12_4_ =
         fVar233 * (fStack_234 * auVar167._12_4_ + fVar233 * fStack_1b4) + auVar167._12_4_ * fVar259
    ;
    auVar373._16_4_ =
         fVar234 * (fStack_230 * auVar167._16_4_ + fVar234 * fStack_1b0) + auVar167._16_4_ * fVar262
    ;
    auVar373._20_4_ =
         fVar235 * (fStack_22c * auVar167._20_4_ + fVar235 * fStack_1ac) + auVar167._20_4_ * fVar265
    ;
    auVar373._24_4_ =
         fVar251 * (fStack_228 * auVar167._24_4_ + fVar251 * fStack_1a8) + auVar167._24_4_ * fVar284
    ;
    auVar373._28_4_ = fVar286 + auVar338._28_4_ + fVar387;
    auVar384._0_4_ =
         fVar230 * ((float)local_260._0_4_ * auVar167._0_4_ + fVar230 * (float)local_1e0._0_4_) +
         auVar167._0_4_ * fVar288;
    auVar384._4_4_ =
         fVar231 * ((float)local_260._4_4_ * auVar167._4_4_ + fVar231 * (float)local_1e0._4_4_) +
         auVar167._4_4_ * fVar290;
    auVar384._8_4_ =
         fVar232 * (fStack_258 * auVar167._8_4_ + fVar232 * fStack_1d8) + auVar167._8_4_ * fVar292;
    auVar384._12_4_ =
         fVar233 * (fStack_254 * auVar167._12_4_ + fVar233 * fStack_1d4) + auVar167._12_4_ * fVar294
    ;
    auVar384._16_4_ =
         fVar234 * (fStack_250 * auVar167._16_4_ + fVar234 * fStack_1d0) + auVar167._16_4_ * fVar257
    ;
    auVar384._20_4_ =
         fVar235 * (fStack_24c * auVar167._20_4_ + fVar235 * fStack_1cc) + auVar167._20_4_ * fVar260
    ;
    auVar384._24_4_ =
         fVar251 * (fStack_248 * auVar167._24_4_ + fVar251 * fStack_1c8) + auVar167._24_4_ * fVar263
    ;
    auVar384._28_4_ = fStack_2c4 + fVar387;
    auVar332._0_4_ =
         auVar167._0_4_ * fVar266 +
         fVar230 * ((float)local_280._0_4_ * auVar167._0_4_ + fVar230 * (float)local_200._0_4_);
    auVar332._4_4_ =
         auVar167._4_4_ * fVar285 +
         fVar231 * ((float)local_280._4_4_ * auVar167._4_4_ + fVar231 * (float)local_200._4_4_);
    auVar332._8_4_ =
         auVar167._8_4_ * fVar287 + fVar232 * (fStack_278 * auVar167._8_4_ + fVar232 * fStack_1f8);
    auVar332._12_4_ =
         auVar167._12_4_ * fVar289 + fVar233 * (fStack_274 * auVar167._12_4_ + fVar233 * fStack_1f4)
    ;
    auVar332._16_4_ =
         auVar167._16_4_ * fVar291 + fVar234 * (fStack_270 * auVar167._16_4_ + fVar234 * fStack_1f0)
    ;
    auVar332._20_4_ =
         auVar167._20_4_ * fVar293 + fVar235 * (fStack_26c * auVar167._20_4_ + fVar235 * fStack_1ec)
    ;
    auVar332._24_4_ =
         auVar167._24_4_ * fVar295 + fVar251 * (fStack_268 * auVar167._24_4_ + fVar251 * fStack_1e8)
    ;
    auVar332._28_4_ = fStack_2c4 + fStack_2a4;
    auVar421._0_4_ =
         (auVar167._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar230) *
         auVar167._0_4_ + fVar230 * fVar297;
    auVar421._4_4_ =
         (auVar167._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar231) *
         auVar167._4_4_ + fVar231 * fVar312;
    auVar421._8_4_ =
         (auVar167._8_4_ * fStack_318 + fStack_298 * fVar232) * auVar167._8_4_ + fVar232 * fVar314;
    auVar421._12_4_ =
         (auVar167._12_4_ * fStack_314 + fStack_294 * fVar233) * auVar167._12_4_ + fVar233 * fVar316
    ;
    auVar421._16_4_ =
         (auVar167._16_4_ * fStack_310 + fStack_290 * fVar234) * auVar167._16_4_ + fVar234 * fVar318
    ;
    auVar421._20_4_ =
         (auVar167._20_4_ * fStack_30c + fStack_28c * fVar235) * auVar167._20_4_ + fVar235 * fVar320
    ;
    auVar421._24_4_ =
         (auVar167._24_4_ * fStack_308 + fStack_288 * fVar251) * auVar167._24_4_ + fVar251 * fVar322
    ;
    auVar421._28_4_ = fStack_2c4 + fVar286 + auVar311._28_4_;
    auVar222._0_4_ =
         (auVar167._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar230) *
         auVar167._0_4_ + fVar230 * fVar252;
    auVar222._4_4_ =
         (auVar167._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar231) *
         auVar167._4_4_ + fVar231 * fVar254;
    auVar222._8_4_ =
         (auVar167._8_4_ * fStack_338 + fStack_2b8 * fVar232) * auVar167._8_4_ + fVar232 * fVar256;
    auVar222._12_4_ =
         (auVar167._12_4_ * fStack_334 + fStack_2b4 * fVar233) * auVar167._12_4_ + fVar233 * fVar259
    ;
    auVar222._16_4_ =
         (auVar167._16_4_ * fStack_330 + fStack_2b0 * fVar234) * auVar167._16_4_ + fVar234 * fVar262
    ;
    auVar222._20_4_ =
         (auVar167._20_4_ * fStack_32c + fStack_2ac * fVar235) * auVar167._20_4_ + fVar235 * fVar265
    ;
    auVar222._24_4_ =
         (auVar167._24_4_ * fStack_328 + fStack_2a8 * fVar251) * auVar167._24_4_ + fVar251 * fVar284
    ;
    auVar222._28_4_ = fStack_2c4 + auVar250._28_4_ + fVar286;
    auVar246._0_4_ =
         auVar167._0_4_ *
         (auVar167._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar230) +
         fVar230 * fVar288;
    auVar246._4_4_ =
         auVar167._4_4_ *
         (auVar167._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar231) +
         fVar231 * fVar290;
    auVar246._8_4_ =
         auVar167._8_4_ * (auVar167._8_4_ * fStack_358 + fStack_2d8 * fVar232) + fVar232 * fVar292;
    auVar246._12_4_ =
         auVar167._12_4_ * (auVar167._12_4_ * fStack_354 + fStack_2d4 * fVar233) + fVar233 * fVar294
    ;
    auVar246._16_4_ =
         auVar167._16_4_ * (auVar167._16_4_ * fStack_350 + fStack_2d0 * fVar234) + fVar234 * fVar257
    ;
    auVar246._20_4_ =
         auVar167._20_4_ * (auVar167._20_4_ * fStack_34c + fStack_2cc * fVar235) + fVar235 * fVar260
    ;
    auVar246._24_4_ =
         auVar167._24_4_ * (auVar167._24_4_ * fStack_348 + fStack_2c8 * fVar251) + fVar251 * fVar263
    ;
    auVar246._28_4_ = fVar398 + auVar250._28_4_ + 1.0;
    auVar276._0_4_ =
         (auVar167._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar230) *
         auVar167._0_4_ + fVar230 * fVar266;
    auVar276._4_4_ =
         (auVar167._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar231) *
         auVar167._4_4_ + fVar231 * fVar285;
    auVar276._8_4_ =
         (auVar167._8_4_ * fStack_378 + fStack_2f8 * fVar232) * auVar167._8_4_ + fVar232 * fVar287;
    auVar276._12_4_ =
         (auVar167._12_4_ * fStack_374 + fStack_2f4 * fVar233) * auVar167._12_4_ + fVar233 * fVar289
    ;
    auVar276._16_4_ =
         (auVar167._16_4_ * fStack_370 + fStack_2f0 * fVar234) * auVar167._16_4_ + fVar234 * fVar291
    ;
    auVar276._20_4_ =
         (auVar167._20_4_ * fStack_36c + fStack_2ec * fVar235) * auVar167._20_4_ + fVar235 * fVar293
    ;
    auVar276._24_4_ =
         (auVar167._24_4_ * fStack_368 + fStack_2e8 * fVar251) * auVar167._24_4_ + fVar251 * fVar295
    ;
    auVar276._28_4_ = fVar419 + fVar387 + 1.0;
    fVar101 = auVar367._0_4_ * fVar230 + auVar421._0_4_ * auVar167._0_4_;
    fVar129 = auVar367._4_4_ * fVar231 + auVar421._4_4_ * auVar167._4_4_;
    fVar132 = auVar367._8_4_ * fVar232 + auVar421._8_4_ * auVar167._8_4_;
    fVar135 = auVar367._12_4_ * fVar233 + auVar421._12_4_ * auVar167._12_4_;
    fVar137 = auVar367._16_4_ * fVar234 + auVar421._16_4_ * auVar167._16_4_;
    fVar139 = auVar367._20_4_ * fVar235 + auVar421._20_4_ * auVar167._20_4_;
    fVar141 = auVar367._24_4_ * fVar251 + auVar421._24_4_ * auVar167._24_4_;
    fVar143 = fVar419 + fStack_2c4;
    fVar102 = auVar373._0_4_ * fVar230 + auVar167._0_4_ * auVar222._0_4_;
    fVar130 = auVar373._4_4_ * fVar231 + auVar167._4_4_ * auVar222._4_4_;
    fVar133 = auVar373._8_4_ * fVar232 + auVar167._8_4_ * auVar222._8_4_;
    fVar136 = auVar373._12_4_ * fVar233 + auVar167._12_4_ * auVar222._12_4_;
    fVar138 = auVar373._16_4_ * fVar234 + auVar167._16_4_ * auVar222._16_4_;
    fVar140 = auVar373._20_4_ * fVar235 + auVar167._20_4_ * auVar222._20_4_;
    fVar142 = auVar373._24_4_ * fVar251 + auVar167._24_4_ * auVar222._24_4_;
    fVar144 = fStack_2c4 + fVar398;
    local_540._0_4_ = auVar384._0_4_ * fVar230 + auVar167._0_4_ * auVar246._0_4_;
    local_540._4_4_ = auVar384._4_4_ * fVar231 + auVar167._4_4_ * auVar246._4_4_;
    local_540._8_4_ = auVar384._8_4_ * fVar232 + auVar167._8_4_ * auVar246._8_4_;
    local_540._12_4_ = auVar384._12_4_ * fVar233 + auVar167._12_4_ * auVar246._12_4_;
    local_540._16_4_ = auVar384._16_4_ * fVar234 + auVar167._16_4_ * auVar246._16_4_;
    local_540._20_4_ = auVar384._20_4_ * fVar235 + auVar167._20_4_ * auVar246._20_4_;
    local_540._24_4_ = auVar384._24_4_ * fVar251 + auVar167._24_4_ * auVar246._24_4_;
    local_540._28_4_ = fVar398 + fStack_2c4;
    local_740._0_4_ = fVar230 * auVar332._0_4_ + auVar167._0_4_ * auVar276._0_4_;
    local_740._4_4_ = fVar231 * auVar332._4_4_ + auVar167._4_4_ * auVar276._4_4_;
    local_740._8_4_ = fVar232 * auVar332._8_4_ + auVar167._8_4_ * auVar276._8_4_;
    local_740._12_4_ = fVar233 * auVar332._12_4_ + auVar167._12_4_ * auVar276._12_4_;
    local_740._16_4_ = fVar234 * auVar332._16_4_ + auVar167._16_4_ * auVar276._16_4_;
    local_740._20_4_ = fVar235 * auVar332._20_4_ + auVar167._20_4_ * auVar276._20_4_;
    local_740._24_4_ = fVar251 * auVar332._24_4_ + auVar167._24_4_ * auVar276._24_4_;
    local_740._28_4_ = auVar114._28_4_ + auVar167._28_4_;
    auVar14 = vsubps_avx(auVar421,auVar367);
    auVar114 = vsubps_avx(auVar222,auVar373);
    auVar354 = vsubps_avx(auVar246,auVar384);
    auVar15 = vsubps_avx(auVar276,auVar332);
    auVar148 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.04761905)),
                           ZEXT416((uint)(fVar229 * 0.04761905)),0);
    fVar257 = auVar148._0_4_;
    fVar324 = fVar257 * auVar14._0_4_ * 3.0;
    fVar260 = auVar148._4_4_;
    fVar339 = fVar260 * auVar14._4_4_ * 3.0;
    local_9c0._4_4_ = fVar339;
    local_9c0._0_4_ = fVar324;
    fVar291 = auVar148._8_4_;
    fVar340 = fVar291 * auVar14._8_4_ * 3.0;
    fStack_9b8 = fVar340;
    fVar284 = auVar148._12_4_;
    fVar342 = fVar284 * auVar14._12_4_ * 3.0;
    fStack_9b4 = fVar342;
    fVar344 = fVar257 * auVar14._16_4_ * 3.0;
    unique0x1000a584 = fVar344;
    fVar346 = fVar260 * auVar14._20_4_ * 3.0;
    unique0x1000a588 = fVar346;
    fVar348 = fVar291 * auVar14._24_4_ * 3.0;
    unique0x1000a58c = fVar348;
    unique0x1000a590 = auVar332._28_4_;
    fVar388 = fVar257 * auVar114._0_4_ * 3.0;
    fVar392 = fVar260 * auVar114._4_4_ * 3.0;
    local_b00._4_4_ = fVar392;
    local_b00._0_4_ = fVar388;
    fVar393 = fVar291 * auVar114._8_4_ * 3.0;
    local_b00._8_4_ = fVar393;
    fVar394 = fVar284 * auVar114._12_4_ * 3.0;
    local_b00._12_4_ = fVar394;
    fVar395 = fVar257 * auVar114._16_4_ * 3.0;
    local_b00._16_4_ = fVar395;
    fVar396 = fVar260 * auVar114._20_4_ * 3.0;
    local_b00._20_4_ = fVar396;
    fVar397 = fVar291 * auVar114._24_4_ * 3.0;
    local_b00._24_4_ = fVar397;
    local_b00._28_4_ = fVar398;
    fVar399 = fVar257 * auVar354._0_4_ * 3.0;
    fVar406 = fVar260 * auVar354._4_4_ * 3.0;
    auVar26._4_4_ = fVar406;
    auVar26._0_4_ = fVar399;
    fVar409 = fVar291 * auVar354._8_4_ * 3.0;
    auVar26._8_4_ = fVar409;
    fVar411 = fVar284 * auVar354._12_4_ * 3.0;
    auVar26._12_4_ = fVar411;
    fVar413 = fVar257 * auVar354._16_4_ * 3.0;
    auVar26._16_4_ = fVar413;
    fVar415 = fVar260 * auVar354._20_4_ * 3.0;
    auVar26._20_4_ = fVar415;
    fVar417 = fVar291 * auVar354._24_4_ * 3.0;
    auVar26._24_4_ = fVar417;
    auVar26._28_4_ = fVar419;
    fVar235 = fVar257 * auVar15._0_4_ * 3.0;
    fVar251 = fVar260 * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fVar251;
    auVar27._0_4_ = fVar235;
    fVar265 = fVar291 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fVar265;
    fVar284 = fVar284 * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fVar284;
    fVar257 = fVar257 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = fVar257;
    fVar260 = fVar260 * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fVar260;
    fVar291 = fVar291 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fVar291;
    auVar27._28_4_ = auVar14._28_4_;
    auVar85._4_4_ = fVar130;
    auVar85._0_4_ = fVar102;
    auVar85._8_4_ = fVar133;
    auVar85._12_4_ = fVar136;
    auVar85._16_4_ = fVar138;
    auVar85._20_4_ = fVar140;
    auVar85._24_4_ = fVar142;
    auVar85._28_4_ = fVar144;
    auVar114 = vperm2f128_avx(auVar85,auVar85,1);
    auVar114 = vshufps_avx(auVar114,auVar85,0x30);
    auVar15 = vshufps_avx(auVar85,auVar114,0x29);
    auVar114 = vperm2f128_avx(local_540,local_540,1);
    auVar114 = vshufps_avx(auVar114,local_540,0x30);
    local_a40 = vshufps_avx(local_540,auVar114,0x29);
    auVar354 = vsubps_avx(local_740,auVar27);
    auVar114 = vperm2f128_avx(auVar354,auVar354,1);
    auVar114 = vshufps_avx(auVar114,auVar354,0x30);
    local_760 = vshufps_avx(auVar354,auVar114,0x29);
    local_580 = vsubps_avx(auVar15,auVar85);
    local_560 = vsubps_avx(local_a40,local_540);
    fVar230 = local_580._0_4_;
    fVar252 = local_580._4_4_;
    auVar28._4_4_ = fVar406 * fVar252;
    auVar28._0_4_ = fVar399 * fVar230;
    fVar286 = local_580._8_4_;
    auVar28._8_4_ = fVar409 * fVar286;
    fVar263 = local_580._12_4_;
    auVar28._12_4_ = fVar411 * fVar263;
    fVar295 = local_580._16_4_;
    auVar28._16_4_ = fVar413 * fVar295;
    fVar322 = local_580._20_4_;
    auVar28._20_4_ = fVar415 * fVar322;
    fVar19 = local_580._24_4_;
    auVar28._24_4_ = fVar417 * fVar19;
    auVar28._28_4_ = auVar354._28_4_;
    fVar231 = local_560._0_4_;
    fVar254 = local_560._4_4_;
    auVar29._4_4_ = fVar392 * fVar254;
    auVar29._0_4_ = fVar388 * fVar231;
    fVar288 = local_560._8_4_;
    auVar29._8_4_ = fVar393 * fVar288;
    fVar266 = local_560._12_4_;
    auVar29._12_4_ = fVar394 * fVar266;
    fVar297 = local_560._16_4_;
    auVar29._16_4_ = fVar395 * fVar297;
    fVar387 = local_560._20_4_;
    auVar29._20_4_ = fVar396 * fVar387;
    fVar20 = local_560._24_4_;
    auVar29._24_4_ = fVar397 * fVar20;
    auVar29._28_4_ = auVar114._28_4_;
    auVar405 = vsubps_avx(auVar29,auVar28);
    auVar83._4_4_ = fVar129;
    auVar83._0_4_ = fVar101;
    auVar83._8_4_ = fVar132;
    auVar83._12_4_ = fVar135;
    auVar83._16_4_ = fVar137;
    auVar83._20_4_ = fVar139;
    auVar83._24_4_ = fVar141;
    auVar83._28_4_ = fVar143;
    auVar114 = vperm2f128_avx(auVar83,auVar83,1);
    auVar114 = vshufps_avx(auVar114,auVar83,0x30);
    auVar16 = vshufps_avx(auVar83,auVar114,0x29);
    local_5a0 = vsubps_avx(auVar16,auVar83);
    auVar30._4_4_ = fVar254 * fVar339;
    auVar30._0_4_ = fVar231 * fVar324;
    auVar30._8_4_ = fVar288 * fVar340;
    auVar30._12_4_ = fVar266 * fVar342;
    auVar30._16_4_ = fVar297 * fVar344;
    auVar30._20_4_ = fVar387 * fVar346;
    auVar30._24_4_ = fVar20 * fVar348;
    auVar30._28_4_ = auVar114._28_4_;
    fVar232 = local_5a0._0_4_;
    fVar256 = local_5a0._4_4_;
    auVar31._4_4_ = fVar406 * fVar256;
    auVar31._0_4_ = fVar399 * fVar232;
    fVar290 = local_5a0._8_4_;
    auVar31._8_4_ = fVar409 * fVar290;
    fVar285 = local_5a0._12_4_;
    auVar31._12_4_ = fVar411 * fVar285;
    fVar312 = local_5a0._16_4_;
    auVar31._16_4_ = fVar413 * fVar312;
    fVar419 = local_5a0._20_4_;
    auVar31._20_4_ = fVar415 * fVar419;
    fVar21 = local_5a0._24_4_;
    auVar31._24_4_ = fVar417 * fVar21;
    auVar31._28_4_ = fVar143;
    auVar17 = vsubps_avx(auVar31,auVar30);
    auVar32._4_4_ = fVar392 * fVar256;
    auVar32._0_4_ = fVar388 * fVar232;
    auVar32._8_4_ = fVar393 * fVar290;
    auVar32._12_4_ = fVar394 * fVar285;
    auVar32._16_4_ = fVar395 * fVar312;
    auVar32._20_4_ = fVar396 * fVar419;
    auVar32._24_4_ = fVar397 * fVar21;
    auVar32._28_4_ = fVar143;
    auVar33._4_4_ = fVar252 * fVar339;
    auVar33._0_4_ = fVar230 * fVar324;
    auVar33._8_4_ = fVar286 * fVar340;
    auVar33._12_4_ = fVar263 * fVar342;
    auVar33._16_4_ = fVar295 * fVar344;
    auVar33._20_4_ = fVar322 * fVar346;
    auVar33._24_4_ = fVar19 * fVar348;
    auVar33._28_4_ = auVar373._28_4_;
    auVar308 = vsubps_avx(auVar33,auVar32);
    fVar229 = auVar308._28_4_;
    fVar293 = auVar17._28_4_ + fVar229;
    auVar223._0_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar231 * fVar231;
    auVar223._4_4_ = fVar256 * fVar256 + fVar252 * fVar252 + fVar254 * fVar254;
    auVar223._8_4_ = fVar290 * fVar290 + fVar286 * fVar286 + fVar288 * fVar288;
    auVar223._12_4_ = fVar285 * fVar285 + fVar263 * fVar263 + fVar266 * fVar266;
    auVar223._16_4_ = fVar312 * fVar312 + fVar295 * fVar295 + fVar297 * fVar297;
    auVar223._20_4_ = fVar419 * fVar419 + fVar322 * fVar322 + fVar387 * fVar387;
    auVar223._24_4_ = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
    auVar223._28_4_ = fVar229 + fVar229 + fVar293;
    auVar114 = vrcpps_avx(auVar223);
    fVar318 = auVar114._0_4_;
    fVar320 = auVar114._4_4_;
    auVar34._4_4_ = fVar320 * auVar223._4_4_;
    auVar34._0_4_ = fVar318 * auVar223._0_4_;
    fVar253 = auVar114._8_4_;
    auVar34._8_4_ = fVar253 * auVar223._8_4_;
    fVar255 = auVar114._12_4_;
    auVar34._12_4_ = fVar255 * auVar223._12_4_;
    fVar258 = auVar114._16_4_;
    auVar34._16_4_ = fVar258 * auVar223._16_4_;
    fVar261 = auVar114._20_4_;
    auVar34._20_4_ = fVar261 * auVar223._20_4_;
    fVar264 = auVar114._24_4_;
    auVar34._24_4_ = fVar264 * auVar223._24_4_;
    auVar34._28_4_ = auVar373._28_4_;
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = &DAT_3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar18 = vsubps_avx(auVar119,auVar34);
    fVar318 = auVar18._0_4_ * fVar318 + fVar318;
    fVar320 = auVar18._4_4_ * fVar320 + fVar320;
    fVar253 = auVar18._8_4_ * fVar253 + fVar253;
    fVar255 = auVar18._12_4_ * fVar255 + fVar255;
    fVar258 = auVar18._16_4_ * fVar258 + fVar258;
    fVar261 = auVar18._20_4_ * fVar261 + fVar261;
    fVar264 = auVar18._24_4_ * fVar264 + fVar264;
    auVar354 = vperm2f128_avx(local_b00,local_b00,1);
    auVar354 = vshufps_avx(auVar354,local_b00,0x30);
    local_960 = vshufps_avx(local_b00,auVar354,0x29);
    auVar354 = vperm2f128_avx(auVar26,auVar26,1);
    auVar354 = vshufps_avx(auVar354,auVar26,0x30);
    local_900 = vshufps_avx(auVar26,auVar354,0x29);
    fVar400 = local_900._0_4_;
    fVar407 = local_900._4_4_;
    auVar35._4_4_ = fVar407 * fVar252;
    auVar35._0_4_ = fVar400 * fVar230;
    fVar410 = local_900._8_4_;
    auVar35._8_4_ = fVar410 * fVar286;
    fVar412 = local_900._12_4_;
    auVar35._12_4_ = fVar412 * fVar263;
    fVar414 = local_900._16_4_;
    auVar35._16_4_ = fVar414 * fVar295;
    fVar416 = local_900._20_4_;
    auVar35._20_4_ = fVar416 * fVar322;
    fVar418 = local_900._24_4_;
    auVar35._24_4_ = fVar418 * fVar19;
    auVar35._28_4_ = auVar354._28_4_;
    fVar233 = local_960._0_4_;
    fVar259 = local_960._4_4_;
    auVar36._4_4_ = fVar254 * fVar259;
    auVar36._0_4_ = fVar231 * fVar233;
    fVar292 = local_960._8_4_;
    auVar36._8_4_ = fVar288 * fVar292;
    fVar287 = local_960._12_4_;
    auVar36._12_4_ = fVar266 * fVar287;
    fVar314 = local_960._16_4_;
    auVar36._16_4_ = fVar297 * fVar314;
    fVar296 = local_960._20_4_;
    auVar36._20_4_ = fVar387 * fVar296;
    fVar22 = local_960._24_4_;
    auVar36._24_4_ = fVar20 * fVar22;
    auVar36._28_4_ = fVar398;
    auVar24 = vsubps_avx(auVar36,auVar35);
    auVar354 = vperm2f128_avx(_local_9c0,_local_9c0,1);
    auVar354 = vshufps_avx(auVar354,_local_9c0,0x30);
    local_a20 = vshufps_avx(_local_9c0,auVar354,0x29);
    fVar234 = local_a20._0_4_;
    fVar262 = local_a20._4_4_;
    auVar37._4_4_ = fVar254 * fVar262;
    auVar37._0_4_ = fVar231 * fVar234;
    fVar294 = local_a20._8_4_;
    auVar37._8_4_ = fVar288 * fVar294;
    fVar289 = local_a20._12_4_;
    auVar37._12_4_ = fVar266 * fVar289;
    fVar316 = local_a20._16_4_;
    auVar37._16_4_ = fVar297 * fVar316;
    fVar398 = local_a20._20_4_;
    auVar37._20_4_ = fVar387 * fVar398;
    fVar23 = local_a20._24_4_;
    auVar37._24_4_ = fVar20 * fVar23;
    auVar37._28_4_ = auVar354._28_4_;
    auVar38._4_4_ = fVar407 * fVar256;
    auVar38._0_4_ = fVar400 * fVar232;
    auVar38._8_4_ = fVar410 * fVar290;
    auVar38._12_4_ = fVar412 * fVar285;
    auVar38._16_4_ = fVar414 * fVar312;
    auVar38._20_4_ = fVar416 * fVar419;
    uVar11 = local_900._28_4_;
    auVar38._24_4_ = fVar418 * fVar21;
    auVar38._28_4_ = uVar11;
    auVar25 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar256 * fVar259;
    auVar39._0_4_ = fVar232 * fVar233;
    auVar39._8_4_ = fVar290 * fVar292;
    auVar39._12_4_ = fVar285 * fVar287;
    auVar39._16_4_ = fVar312 * fVar314;
    auVar39._20_4_ = fVar419 * fVar296;
    auVar39._24_4_ = fVar21 * fVar22;
    auVar39._28_4_ = uVar11;
    auVar40._4_4_ = fVar252 * fVar262;
    auVar40._0_4_ = fVar230 * fVar234;
    auVar40._8_4_ = fVar286 * fVar294;
    auVar40._12_4_ = fVar263 * fVar289;
    auVar40._16_4_ = fVar295 * fVar316;
    auVar40._20_4_ = fVar322 * fVar398;
    auVar40._24_4_ = fVar19 * fVar23;
    auVar40._28_4_ = auVar421._28_4_;
    auVar354 = vsubps_avx(auVar40,auVar39);
    fVar229 = auVar354._28_4_;
    auVar41._4_4_ =
         (auVar405._4_4_ * auVar405._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar308._4_4_ * auVar308._4_4_) * fVar320;
    auVar41._0_4_ =
         (auVar405._0_4_ * auVar405._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar308._0_4_ * auVar308._0_4_) * fVar318;
    auVar41._8_4_ =
         (auVar405._8_4_ * auVar405._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar308._8_4_ * auVar308._8_4_) * fVar253;
    auVar41._12_4_ =
         (auVar405._12_4_ * auVar405._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar308._12_4_ * auVar308._12_4_) * fVar255;
    auVar41._16_4_ =
         (auVar405._16_4_ * auVar405._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar308._16_4_ * auVar308._16_4_) * fVar258;
    auVar41._20_4_ =
         (auVar405._20_4_ * auVar405._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar308._20_4_ * auVar308._20_4_) * fVar261;
    auVar41._24_4_ =
         (auVar405._24_4_ * auVar405._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar308._24_4_ * auVar308._24_4_) * fVar264;
    auVar41._28_4_ = auVar405._28_4_ + fVar293;
    auVar42._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar354._4_4_ * auVar354._4_4_) * fVar320;
    auVar42._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar354._0_4_ * auVar354._0_4_) * fVar318;
    auVar42._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar354._8_4_ * auVar354._8_4_) * fVar253;
    auVar42._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar354._12_4_ * auVar354._12_4_) * fVar255;
    auVar42._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar354._16_4_ * auVar354._16_4_) * fVar258;
    auVar42._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar354._20_4_ * auVar354._20_4_) * fVar261;
    auVar42._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar354._24_4_ * auVar354._24_4_) * fVar264;
    auVar42._28_4_ = auVar18._28_4_ + auVar114._28_4_;
    auVar114 = vmaxps_avx(auVar41,auVar42);
    auVar354 = vperm2f128_avx(local_740,local_740,1);
    auVar354 = vshufps_avx(auVar354,local_740,0x30);
    local_780 = vshufps_avx(local_740,auVar354,0x29);
    local_7a0._0_4_ = (float)local_740._0_4_ + fVar235;
    local_7a0._4_4_ = local_740._4_4_ + fVar251;
    local_7a0._8_4_ = local_740._8_4_ + fVar265;
    local_7a0._12_4_ = local_740._12_4_ + fVar284;
    local_7a0._16_4_ = local_740._16_4_ + fVar257;
    local_7a0._20_4_ = local_740._20_4_ + fVar260;
    local_7a0._24_4_ = local_740._24_4_ + fVar291;
    local_7a0._28_4_ = local_740._28_4_ + auVar14._28_4_;
    auVar354 = vmaxps_avx(local_740,local_7a0);
    auVar14 = vmaxps_avx(local_760,local_780);
    auVar354 = vmaxps_avx(auVar354,auVar14);
    auVar14 = vrsqrtps_avx(auVar223);
    fVar235 = auVar14._0_4_;
    fVar251 = auVar14._4_4_;
    fVar265 = auVar14._8_4_;
    fVar284 = auVar14._12_4_;
    fVar257 = auVar14._16_4_;
    fVar260 = auVar14._20_4_;
    fVar291 = auVar14._24_4_;
    local_400 = fVar235 * 1.5 + fVar235 * fVar235 * fVar235 * auVar223._0_4_ * -0.5;
    fStack_3fc = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar223._4_4_ * -0.5;
    fStack_3f8 = fVar265 * 1.5 + fVar265 * fVar265 * fVar265 * auVar223._8_4_ * -0.5;
    fStack_3f4 = fVar284 * 1.5 + fVar284 * fVar284 * fVar284 * auVar223._12_4_ * -0.5;
    fStack_3f0 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar223._16_4_ * -0.5;
    fStack_3ec = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar223._20_4_ * -0.5;
    fStack_3e8 = fVar291 * 1.5 + fVar291 * fVar291 * fVar291 * auVar223._24_4_ * -0.5;
    fStack_3e4 = auVar14._28_4_ + auVar223._28_4_;
    auVar86._4_4_ = fVar130;
    auVar86._0_4_ = fVar102;
    auVar86._8_4_ = fVar133;
    auVar86._12_4_ = fVar136;
    auVar86._16_4_ = fVar138;
    auVar86._20_4_ = fVar140;
    auVar86._24_4_ = fVar142;
    auVar86._28_4_ = fVar144;
    local_9e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar86);
    auVar405 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar424 = auVar405._0_4_;
    fVar426 = auVar405._4_4_;
    fVar427 = auVar405._8_4_;
    fVar428 = auVar405._12_4_;
    fVar429 = auVar405._16_4_;
    fVar430 = auVar405._20_4_;
    fVar431 = auVar405._24_4_;
    fVar235 = local_9e0._0_4_;
    fVar265 = local_9e0._4_4_;
    fVar257 = local_9e0._8_4_;
    fVar291 = local_9e0._12_4_;
    fVar318 = local_9e0._16_4_;
    fVar253 = local_9e0._20_4_;
    fVar258 = local_9e0._24_4_;
    auVar84._4_4_ = fVar129;
    auVar84._0_4_ = fVar101;
    auVar84._8_4_ = fVar132;
    auVar84._12_4_ = fVar135;
    auVar84._16_4_ = fVar137;
    auVar84._20_4_ = fVar139;
    auVar84._24_4_ = fVar141;
    auVar84._28_4_ = fVar143;
    auVar405 = vsubps_avx(ZEXT832(0) << 0x20,auVar84);
    fVar251 = auVar405._0_4_;
    fVar284 = auVar405._4_4_;
    fVar260 = auVar405._8_4_;
    fVar293 = auVar405._12_4_;
    fVar320 = auVar405._16_4_;
    fVar255 = auVar405._20_4_;
    fVar261 = auVar405._24_4_;
    auVar390._0_4_ =
         (float)local_7c0._0_4_ * fVar251 +
         (float)local_7e0._0_4_ * fVar235 + fVar424 * (float)local_800._0_4_;
    auVar390._4_4_ =
         (float)local_7c0._4_4_ * fVar284 +
         (float)local_7e0._4_4_ * fVar265 + fVar426 * (float)local_800._4_4_;
    auVar390._8_4_ = fStack_7b8 * fVar260 + fStack_7d8 * fVar257 + fVar427 * fStack_7f8;
    auVar390._12_4_ = fStack_7b4 * fVar293 + fStack_7d4 * fVar291 + fVar428 * fStack_7f4;
    auVar390._16_4_ = fStack_7b0 * fVar320 + fStack_7d0 * fVar318 + fVar429 * fStack_7f0;
    auVar390._20_4_ = fStack_7ac * fVar255 + fStack_7cc * fVar253 + fVar430 * fStack_7ec;
    auVar390._24_4_ = fStack_7a8 * fVar261 + fStack_7c8 * fVar258 + fVar431 * fStack_7e8;
    auVar390._28_4_ = fVar229 + auVar25._28_4_ + fVar229 + auVar14._28_4_;
    auVar403._0_4_ = fVar251 * fVar251 + fVar235 * fVar235 + fVar424 * fVar424;
    auVar403._4_4_ = fVar284 * fVar284 + fVar265 * fVar265 + fVar426 * fVar426;
    auVar403._8_4_ = fVar260 * fVar260 + fVar257 * fVar257 + fVar427 * fVar427;
    auVar403._12_4_ = fVar293 * fVar293 + fVar291 * fVar291 + fVar428 * fVar428;
    auVar403._16_4_ = fVar320 * fVar320 + fVar318 * fVar318 + fVar429 * fVar429;
    auVar403._20_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar430 * fVar430;
    auVar403._24_4_ = fVar261 * fVar261 + fVar258 * fVar258 + fVar431 * fVar431;
    auVar403._28_4_ = auVar421._28_4_ + auVar421._28_4_ + fVar229;
    fVar350 = (float)local_7c0._0_4_ * fVar232 * local_400 +
              fVar230 * local_400 * (float)local_7e0._0_4_ +
              fVar231 * local_400 * (float)local_800._0_4_;
    fVar356 = (float)local_7c0._4_4_ * fVar256 * fStack_3fc +
              fVar252 * fStack_3fc * (float)local_7e0._4_4_ +
              fVar254 * fStack_3fc * (float)local_800._4_4_;
    fVar357 = fStack_7b8 * fVar290 * fStack_3f8 +
              fVar286 * fStack_3f8 * fStack_7d8 + fVar288 * fStack_3f8 * fStack_7f8;
    fVar358 = fStack_7b4 * fVar285 * fStack_3f4 +
              fVar263 * fStack_3f4 * fStack_7d4 + fVar266 * fStack_3f4 * fStack_7f4;
    fVar359 = fStack_7b0 * fVar312 * fStack_3f0 +
              fVar295 * fStack_3f0 * fStack_7d0 + fVar297 * fStack_3f0 * fStack_7f0;
    fVar360 = fStack_7ac * fVar419 * fStack_3ec +
              fVar322 * fStack_3ec * fStack_7cc + fVar387 * fStack_3ec * fStack_7ec;
    fVar361 = fStack_7a8 * fVar21 * fStack_3e8 +
              fVar19 * fStack_3e8 * fStack_7c8 + fVar20 * fStack_3e8 * fStack_7e8;
    fVar229 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    fVar370 = fVar251 * fVar232 * local_400 +
              fVar230 * local_400 * fVar235 + fVar424 * fVar231 * local_400;
    fVar374 = fVar284 * fVar256 * fStack_3fc +
              fVar252 * fStack_3fc * fVar265 + fVar426 * fVar254 * fStack_3fc;
    fVar375 = fVar260 * fVar290 * fStack_3f8 +
              fVar286 * fStack_3f8 * fVar257 + fVar427 * fVar288 * fStack_3f8;
    fVar376 = fVar293 * fVar285 * fStack_3f4 +
              fVar263 * fStack_3f4 * fVar291 + fVar428 * fVar266 * fStack_3f4;
    fVar377 = fVar320 * fVar312 * fStack_3f0 +
              fVar295 * fStack_3f0 * fVar318 + fVar429 * fVar297 * fStack_3f0;
    fVar378 = fVar255 * fVar419 * fStack_3ec +
              fVar322 * fStack_3ec * fVar253 + fVar430 * fVar387 * fStack_3ec;
    fVar379 = fVar261 * fVar21 * fStack_3e8 +
              fVar19 * fStack_3e8 * fVar258 + fVar431 * fVar20 * fStack_3e8;
    fVar380 = fStack_7c4 + fVar229;
    auVar43._4_4_ = fVar356 * fVar374;
    auVar43._0_4_ = fVar350 * fVar370;
    auVar43._8_4_ = fVar357 * fVar375;
    auVar43._12_4_ = fVar358 * fVar376;
    auVar43._16_4_ = fVar359 * fVar377;
    auVar43._20_4_ = fVar360 * fVar378;
    auVar43._24_4_ = fVar361 * fVar379;
    auVar43._28_4_ = fVar229;
    auVar17 = vsubps_avx(auVar390,auVar43);
    auVar44._4_4_ = fVar374 * fVar374;
    auVar44._0_4_ = fVar370 * fVar370;
    auVar44._8_4_ = fVar375 * fVar375;
    auVar44._12_4_ = fVar376 * fVar376;
    auVar44._16_4_ = fVar377 * fVar377;
    auVar44._20_4_ = fVar378 * fVar378;
    auVar44._24_4_ = fVar379 * fVar379;
    auVar44._28_4_ = fStack_7c4;
    local_620 = vsubps_avx(auVar403,auVar44);
    auVar14 = vsqrtps_avx(auVar114);
    fVar229 = (auVar14._0_4_ + auVar354._0_4_) * 1.0000002;
    fVar264 = (auVar14._4_4_ + auVar354._4_4_) * 1.0000002;
    fVar185 = (auVar14._8_4_ + auVar354._8_4_) * 1.0000002;
    fVar187 = (auVar14._12_4_ + auVar354._12_4_) * 1.0000002;
    fVar188 = (auVar14._16_4_ + auVar354._16_4_) * 1.0000002;
    fVar189 = (auVar14._20_4_ + auVar354._20_4_) * 1.0000002;
    fVar190 = (auVar14._24_4_ + auVar354._24_4_) * 1.0000002;
    auVar45._4_4_ = fVar264 * fVar264;
    auVar45._0_4_ = fVar229 * fVar229;
    auVar45._8_4_ = fVar185 * fVar185;
    auVar45._12_4_ = fVar187 * fVar187;
    auVar45._16_4_ = fVar188 * fVar188;
    auVar45._20_4_ = fVar189 * fVar189;
    auVar45._24_4_ = fVar190 * fVar190;
    auVar45._28_4_ = auVar14._28_4_ + auVar354._28_4_;
    fVar401 = auVar17._0_4_ + auVar17._0_4_;
    fVar408 = auVar17._4_4_ + auVar17._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar408,fVar401);
    local_5c0._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    local_5c0._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    local_5c0._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    local_5c0._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    local_5c0._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar229 = auVar17._28_4_;
    local_5c0._28_4_ = fVar229 + fVar229;
    auVar354 = vsubps_avx(local_620,auVar45);
    local_420._4_4_ = fVar356 * fVar356;
    local_420._0_4_ = fVar350 * fVar350;
    local_420._8_4_ = fVar357 * fVar357;
    local_420._12_4_ = fVar358 * fVar358;
    local_420._16_4_ = fVar359 * fVar359;
    local_420._20_4_ = fVar360 * fVar360;
    local_420._24_4_ = fVar361 * fVar361;
    local_420._28_4_ = local_5a0._28_4_;
    auVar386 = ZEXT3264(local_420);
    local_660 = vsubps_avx(local_3a0,local_420);
    auVar46._4_4_ = fVar408 * fVar408;
    auVar46._0_4_ = fVar401 * fVar401;
    auVar46._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    auVar46._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    auVar46._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    auVar46._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    auVar46._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    auVar46._28_4_ = fVar229;
    fVar264 = local_660._0_4_;
    fVar185 = local_660._4_4_;
    fVar187 = local_660._8_4_;
    fVar188 = local_660._12_4_;
    fVar189 = local_660._16_4_;
    fVar190 = local_660._20_4_;
    fVar369 = local_660._24_4_;
    auVar47._4_4_ = fVar185 * 4.0 * auVar354._4_4_;
    auVar47._0_4_ = fVar264 * 4.0 * auVar354._0_4_;
    auVar47._8_4_ = fVar187 * 4.0 * auVar354._8_4_;
    auVar47._12_4_ = fVar188 * 4.0 * auVar354._12_4_;
    auVar47._16_4_ = fVar189 * 4.0 * auVar354._16_4_;
    auVar47._20_4_ = fVar190 * 4.0 * auVar354._20_4_;
    auVar47._24_4_ = fVar369 * 4.0 * auVar354._24_4_;
    auVar47._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(auVar46,auVar47);
    auVar114 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
    fVar229 = local_660._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar224._8_4_ = 0x7f800000;
      auVar224._0_8_ = 0x7f8000007f800000;
      auVar224._12_4_ = 0x7f800000;
      auVar224._16_4_ = 0x7f800000;
      auVar224._20_4_ = 0x7f800000;
      auVar224._24_4_ = 0x7f800000;
      auVar224._28_4_ = 0x7f800000;
      auVar422._8_4_ = 0xff800000;
      auVar422._0_8_ = 0xff800000ff800000;
      auVar422._12_4_ = 0xff800000;
      auVar422._16_4_ = 0xff800000;
      auVar422._20_4_ = 0xff800000;
      auVar422._24_4_ = 0xff800000;
      auVar422._28_4_ = 0xff800000;
    }
    else {
      auVar24 = vsqrtps_avx(auVar17);
      auVar305._0_4_ = fVar264 + fVar264;
      auVar305._4_4_ = fVar185 + fVar185;
      auVar305._8_4_ = fVar187 + fVar187;
      auVar305._12_4_ = fVar188 + fVar188;
      auVar305._16_4_ = fVar189 + fVar189;
      auVar305._20_4_ = fVar190 + fVar190;
      auVar305._24_4_ = fVar369 + fVar369;
      auVar305._28_4_ = fVar229 + fVar229;
      auVar18 = vrcpps_avx(auVar305);
      auVar308 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
      fVar298 = auVar18._0_4_;
      fVar313 = auVar18._4_4_;
      auVar48._4_4_ = auVar305._4_4_ * fVar313;
      auVar48._0_4_ = auVar305._0_4_ * fVar298;
      fVar315 = auVar18._8_4_;
      auVar48._8_4_ = auVar305._8_4_ * fVar315;
      fVar317 = auVar18._12_4_;
      auVar48._12_4_ = auVar305._12_4_ * fVar317;
      fVar319 = auVar18._16_4_;
      auVar48._16_4_ = auVar305._16_4_ * fVar319;
      fVar321 = auVar18._20_4_;
      auVar48._20_4_ = auVar305._20_4_ * fVar321;
      fVar323 = auVar18._24_4_;
      auVar48._24_4_ = auVar305._24_4_ * fVar323;
      auVar48._28_4_ = auVar305._28_4_;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar225,auVar48);
      fVar298 = fVar298 + fVar298 * auVar17._0_4_;
      fVar313 = fVar313 + fVar313 * auVar17._4_4_;
      fVar315 = fVar315 + fVar315 * auVar17._8_4_;
      fVar317 = fVar317 + fVar317 * auVar17._12_4_;
      fVar319 = fVar319 + fVar319 * auVar17._16_4_;
      fVar321 = fVar321 + fVar321 * auVar17._20_4_;
      fVar323 = fVar323 + fVar323 * auVar17._24_4_;
      auVar333._0_8_ = CONCAT44(fVar408,fVar401) ^ 0x8000000080000000;
      auVar333._8_4_ = -local_5c0._8_4_;
      auVar333._12_4_ = -local_5c0._12_4_;
      auVar333._16_4_ = -local_5c0._16_4_;
      auVar333._20_4_ = -local_5c0._20_4_;
      auVar333._24_4_ = -local_5c0._24_4_;
      auVar333._28_4_ = -local_5c0._28_4_;
      auVar25 = vsubps_avx(auVar333,auVar24);
      fVar401 = auVar25._0_4_ * fVar298;
      fVar408 = auVar25._4_4_ * fVar313;
      auVar49._4_4_ = fVar408;
      auVar49._0_4_ = fVar401;
      fVar341 = auVar25._8_4_ * fVar315;
      auVar49._8_4_ = fVar341;
      fVar343 = auVar25._12_4_ * fVar317;
      auVar49._12_4_ = fVar343;
      fVar345 = auVar25._16_4_ * fVar319;
      auVar49._16_4_ = fVar345;
      fVar347 = auVar25._20_4_ * fVar321;
      auVar49._20_4_ = fVar347;
      fVar349 = auVar25._24_4_ * fVar323;
      auVar49._24_4_ = fVar349;
      auVar49._28_4_ = auVar25._28_4_;
      auVar24 = vsubps_avx(auVar24,local_5c0);
      fVar298 = auVar24._0_4_ * fVar298;
      fVar313 = auVar24._4_4_ * fVar313;
      auVar50._4_4_ = fVar313;
      auVar50._0_4_ = fVar298;
      fVar315 = auVar24._8_4_ * fVar315;
      auVar50._8_4_ = fVar315;
      fVar317 = auVar24._12_4_ * fVar317;
      auVar50._12_4_ = fVar317;
      fVar319 = auVar24._16_4_ * fVar319;
      auVar50._16_4_ = fVar319;
      fVar321 = auVar24._20_4_ * fVar321;
      auVar50._20_4_ = fVar321;
      fVar323 = auVar24._24_4_ * fVar323;
      auVar50._24_4_ = fVar323;
      auVar50._28_4_ = auVar24._28_4_;
      fStack_4e4 = fVar380 + auVar18._28_4_ + auVar17._28_4_;
      local_500[0] = local_400 * (fVar370 + fVar350 * fVar401);
      local_500[1] = fStack_3fc * (fVar374 + fVar356 * fVar408);
      local_500[2] = fStack_3f8 * (fVar375 + fVar357 * fVar341);
      local_500[3] = fStack_3f4 * (fVar376 + fVar358 * fVar343);
      fStack_4f0 = fStack_3f0 * (fVar377 + fVar359 * fVar345);
      fStack_4ec = fStack_3ec * (fVar378 + fVar360 * fVar347);
      fStack_4e8 = fStack_3e8 * (fVar379 + fVar361 * fVar349);
      local_520[0] = local_400 * (fVar370 + fVar350 * fVar298);
      local_520[1] = fStack_3fc * (fVar374 + fVar356 * fVar313);
      local_520[2] = fStack_3f8 * (fVar375 + fVar357 * fVar315);
      local_520[3] = fStack_3f4 * (fVar376 + fVar358 * fVar317);
      fStack_510 = fStack_3f0 * (fVar377 + fVar359 * fVar319);
      fStack_50c = fStack_3ec * (fVar378 + fVar360 * fVar321);
      fStack_508 = fStack_3e8 * (fVar379 + fVar361 * fVar323);
      fStack_504 = fVar380 + fStack_4e4;
      auVar306._8_4_ = 0x7f800000;
      auVar306._0_8_ = 0x7f8000007f800000;
      auVar306._12_4_ = 0x7f800000;
      auVar306._16_4_ = 0x7f800000;
      auVar306._20_4_ = 0x7f800000;
      auVar306._24_4_ = 0x7f800000;
      auVar306._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar306,auVar49,auVar308);
      auVar334._8_4_ = 0x7fffffff;
      auVar334._0_8_ = 0x7fffffff7fffffff;
      auVar334._12_4_ = 0x7fffffff;
      auVar334._16_4_ = 0x7fffffff;
      auVar334._20_4_ = 0x7fffffff;
      auVar334._24_4_ = 0x7fffffff;
      auVar334._28_4_ = 0x7fffffff;
      auVar17 = vandps_avx(local_420,auVar334);
      auVar17 = vmaxps_avx(local_4e0,auVar17);
      auVar51._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_660,auVar334);
      auVar17 = vcmpps_avx(auVar17,auVar51,1);
      auVar307._8_4_ = 0xff800000;
      auVar307._0_8_ = 0xff800000ff800000;
      auVar307._12_4_ = 0xff800000;
      auVar307._16_4_ = 0xff800000;
      auVar307._20_4_ = 0xff800000;
      auVar307._24_4_ = 0xff800000;
      auVar307._28_4_ = 0xff800000;
      auVar422 = vblendvps_avx(auVar307,auVar50,auVar308);
      auVar18 = auVar308 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar17,auVar308);
        auVar148 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar17 = vcmpps_avx(auVar354,ZEXT832(0) << 0x20,2);
        auVar355._8_4_ = 0xff800000;
        auVar355._0_8_ = 0xff800000ff800000;
        auVar355._12_4_ = 0xff800000;
        auVar355._16_4_ = 0xff800000;
        auVar355._20_4_ = 0xff800000;
        auVar355._24_4_ = 0xff800000;
        auVar355._28_4_ = 0xff800000;
        auVar404._8_4_ = 0x7f800000;
        auVar404._0_8_ = 0x7f8000007f800000;
        auVar404._12_4_ = 0x7f800000;
        auVar404._16_4_ = 0x7f800000;
        auVar404._20_4_ = 0x7f800000;
        auVar404._24_4_ = 0x7f800000;
        auVar404._28_4_ = 0x7f800000;
        auVar354 = vblendvps_avx(auVar404,auVar355,auVar17);
        auVar214 = vpmovsxwd_avx(auVar148);
        auVar148 = vpunpckhwd_avx(auVar148,auVar148);
        auVar283._16_16_ = auVar148;
        auVar283._0_16_ = auVar214;
        auVar224 = vblendvps_avx(auVar224,auVar354,auVar283);
        auVar354 = vblendvps_avx(auVar355,auVar404,auVar17);
        auVar422 = vblendvps_avx(auVar422,auVar354,auVar283);
        auVar354 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar206._0_4_ = auVar114._0_4_ ^ auVar354._0_4_;
        auVar206._4_4_ = auVar114._4_4_ ^ auVar354._4_4_;
        auVar206._8_4_ = auVar114._8_4_ ^ auVar354._8_4_;
        auVar206._12_4_ = auVar114._12_4_ ^ auVar354._12_4_;
        auVar206._16_4_ = auVar114._16_4_ ^ auVar354._16_4_;
        auVar206._20_4_ = auVar114._20_4_ ^ auVar354._20_4_;
        auVar206._24_4_ = auVar114._24_4_ ^ auVar354._24_4_;
        auVar206._28_4_ = auVar114._28_4_ ^ auVar354._28_4_;
        auVar114 = vorps_avx(auVar17,auVar206);
        auVar114 = vandps_avx(auVar308,auVar114);
      }
    }
    auVar354 = local_4c0 & auVar114;
    auVar311 = ZEXT3264(_local_9a0);
    if ((((((((auVar354 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar354 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar354 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar354 >> 0x7f,0) == '\0') &&
          (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar354 >> 0xbf,0) == '\0') &&
        (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar354[0x1f])
    {
      auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar148 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar168._16_16_ = auVar148;
      auVar168._0_16_ = auVar148;
      local_640 = vminps_avx(auVar168,auVar422);
      auVar120._0_4_ =
           (float)local_7c0._0_4_ * fVar324 +
           (float)local_7e0._0_4_ * fVar388 + (float)local_800._0_4_ * fVar399;
      auVar120._4_4_ =
           (float)local_7c0._4_4_ * fVar339 +
           (float)local_7e0._4_4_ * fVar392 + (float)local_800._4_4_ * fVar406;
      auVar120._8_4_ = fStack_7b8 * fVar340 + fStack_7d8 * fVar393 + fStack_7f8 * fVar409;
      auVar120._12_4_ = fStack_7b4 * fVar342 + fStack_7d4 * fVar394 + fStack_7f4 * fVar411;
      auVar120._16_4_ = fStack_7b0 * fVar344 + fStack_7d0 * fVar395 + fStack_7f0 * fVar413;
      auVar120._20_4_ = fStack_7ac * fVar346 + fStack_7cc * fVar396 + fStack_7ec * fVar415;
      auVar120._24_4_ = fStack_7a8 * fVar348 + fStack_7c8 * fVar397 + fStack_7e8 * fVar417;
      auVar120._28_4_ = auVar332._28_4_ + auVar405._28_4_ + 1.0;
      auVar354 = vrcpps_avx(auVar120);
      fVar401 = auVar354._0_4_;
      fVar408 = auVar354._4_4_;
      auVar52._4_4_ = auVar120._4_4_ * fVar408;
      auVar52._0_4_ = auVar120._0_4_ * fVar401;
      fVar298 = auVar354._8_4_;
      auVar52._8_4_ = auVar120._8_4_ * fVar298;
      fVar313 = auVar354._12_4_;
      auVar52._12_4_ = auVar120._12_4_ * fVar313;
      fVar315 = auVar354._16_4_;
      auVar52._16_4_ = auVar120._16_4_ * fVar315;
      fVar317 = auVar354._20_4_;
      auVar52._20_4_ = auVar120._20_4_ * fVar317;
      fVar319 = auVar354._24_4_;
      auVar52._24_4_ = auVar120._24_4_ * fVar319;
      auVar52._28_4_ = 0x3f800000;
      auVar249._8_4_ = 0x3f800000;
      auVar249._0_8_ = &DAT_3f8000003f800000;
      auVar249._12_4_ = 0x3f800000;
      auVar249._16_4_ = 0x3f800000;
      auVar249._20_4_ = 0x3f800000;
      auVar249._24_4_ = 0x3f800000;
      auVar249._28_4_ = 0x3f800000;
      auVar308 = vsubps_avx(auVar249,auVar52);
      auVar335._8_4_ = 0x7fffffff;
      auVar335._0_8_ = 0x7fffffff7fffffff;
      auVar335._12_4_ = 0x7fffffff;
      auVar335._16_4_ = 0x7fffffff;
      auVar335._20_4_ = 0x7fffffff;
      auVar335._24_4_ = 0x7fffffff;
      auVar335._28_4_ = 0x7fffffff;
      auVar354 = vandps_avx(auVar120,auVar335);
      auVar368._8_4_ = 0x219392ef;
      auVar368._0_8_ = 0x219392ef219392ef;
      auVar368._12_4_ = 0x219392ef;
      auVar368._16_4_ = 0x219392ef;
      auVar368._20_4_ = 0x219392ef;
      auVar368._24_4_ = 0x219392ef;
      auVar368._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar354,auVar368,1);
      auVar53._4_4_ =
           (fVar408 + fVar408 * auVar308._4_4_) *
           -(fVar284 * fVar339 + fVar392 * fVar265 + fVar426 * fVar406);
      auVar53._0_4_ =
           (fVar401 + fVar401 * auVar308._0_4_) *
           -(fVar251 * fVar324 + fVar388 * fVar235 + fVar424 * fVar399);
      auVar53._8_4_ =
           (fVar298 + fVar298 * auVar308._8_4_) *
           -(fVar260 * fVar340 + fVar393 * fVar257 + fVar427 * fVar409);
      auVar53._12_4_ =
           (fVar313 + fVar313 * auVar308._12_4_) *
           -(fVar293 * fVar342 + fVar394 * fVar291 + fVar428 * fVar411);
      auVar53._16_4_ =
           (fVar315 + fVar315 * auVar308._16_4_) *
           -(fVar320 * fVar344 + fVar395 * fVar318 + fVar429 * fVar413);
      auVar53._20_4_ =
           (fVar317 + fVar317 * auVar308._20_4_) *
           -(fVar255 * fVar346 + fVar396 * fVar253 + fVar430 * fVar415);
      auVar53._24_4_ =
           (fVar319 + fVar319 * auVar308._24_4_) *
           -(fVar261 * fVar348 + fVar397 * fVar258 + fVar431 * fVar417);
      auVar53._28_4_ = -(auVar405._28_4_ + auVar224._28_4_ + 1.0);
      auVar354 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,1);
      auVar354 = vorps_avx(auVar17,auVar354);
      auVar385._8_4_ = 0xff800000;
      auVar385._0_8_ = 0xff800000ff800000;
      auVar385._12_4_ = 0xff800000;
      auVar385._16_4_ = 0xff800000;
      auVar385._20_4_ = 0xff800000;
      auVar385._24_4_ = 0xff800000;
      auVar385._28_4_ = 0xff800000;
      auVar386 = ZEXT3264(auVar385);
      auVar354 = vblendvps_avx(auVar53,auVar385,auVar354);
      auVar405 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,6);
      auVar405 = vorps_avx(auVar17,auVar405);
      auVar391._8_4_ = 0x7f800000;
      auVar391._0_8_ = 0x7f8000007f800000;
      auVar391._12_4_ = 0x7f800000;
      auVar391._16_4_ = 0x7f800000;
      auVar391._20_4_ = 0x7f800000;
      auVar391._24_4_ = 0x7f800000;
      auVar391._28_4_ = 0x7f800000;
      auVar405 = vblendvps_avx(auVar53,auVar391,auVar405);
      auVar17 = vmaxps_avx(local_3c0,auVar224);
      auVar17 = vmaxps_avx(auVar17,auVar354);
      auVar405 = vminps_avx(local_640,auVar405);
      auVar308 = ZEXT832(0) << 0x20;
      auVar354 = vsubps_avx(auVar308,auVar15);
      auVar15 = vsubps_avx(auVar308,local_a40);
      auVar54._4_4_ = auVar15._4_4_ * -fVar407;
      auVar54._0_4_ = auVar15._0_4_ * -fVar400;
      auVar54._8_4_ = auVar15._8_4_ * -fVar410;
      auVar54._12_4_ = auVar15._12_4_ * -fVar412;
      auVar54._16_4_ = auVar15._16_4_ * -fVar414;
      auVar54._20_4_ = auVar15._20_4_ * -fVar416;
      auVar54._24_4_ = auVar15._24_4_ * -fVar418;
      auVar54._28_4_ = auVar15._28_4_;
      auVar55._4_4_ = fVar259 * auVar354._4_4_;
      auVar55._0_4_ = fVar233 * auVar354._0_4_;
      auVar55._8_4_ = fVar292 * auVar354._8_4_;
      auVar55._12_4_ = fVar287 * auVar354._12_4_;
      auVar55._16_4_ = fVar314 * auVar354._16_4_;
      auVar55._20_4_ = fVar296 * auVar354._20_4_;
      auVar55._24_4_ = fVar22 * auVar354._24_4_;
      auVar55._28_4_ = auVar354._28_4_;
      auVar354 = vsubps_avx(auVar54,auVar55);
      auVar15 = vsubps_avx(auVar308,auVar16);
      auVar56._4_4_ = fVar262 * auVar15._4_4_;
      auVar56._0_4_ = fVar234 * auVar15._0_4_;
      auVar56._8_4_ = fVar294 * auVar15._8_4_;
      auVar56._12_4_ = fVar289 * auVar15._12_4_;
      auVar56._16_4_ = fVar316 * auVar15._16_4_;
      auVar56._20_4_ = fVar398 * auVar15._20_4_;
      uVar1 = auVar15._28_4_;
      auVar56._24_4_ = fVar23 * auVar15._24_4_;
      auVar56._28_4_ = uVar1;
      auVar308 = vsubps_avx(auVar354,auVar56);
      auVar57._4_4_ = (float)local_800._4_4_ * -fVar407;
      auVar57._0_4_ = (float)local_800._0_4_ * -fVar400;
      auVar57._8_4_ = fStack_7f8 * -fVar410;
      auVar57._12_4_ = fStack_7f4 * -fVar412;
      auVar57._16_4_ = fStack_7f0 * -fVar414;
      auVar57._20_4_ = fStack_7ec * -fVar416;
      auVar57._24_4_ = fStack_7e8 * -fVar418;
      auVar57._28_4_ = uVar11 ^ 0x80000000;
      auVar58._4_4_ = (float)local_7e0._4_4_ * fVar259;
      auVar58._0_4_ = (float)local_7e0._0_4_ * fVar233;
      auVar58._8_4_ = fStack_7d8 * fVar292;
      auVar58._12_4_ = fStack_7d4 * fVar287;
      auVar58._16_4_ = fStack_7d0 * fVar314;
      auVar58._20_4_ = fStack_7cc * fVar296;
      auVar58._24_4_ = fStack_7c8 * fVar22;
      auVar58._28_4_ = uVar1;
      auVar354 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = (float)local_7c0._4_4_ * fVar262;
      auVar59._0_4_ = (float)local_7c0._0_4_ * fVar234;
      auVar59._8_4_ = fStack_7b8 * fVar294;
      auVar59._12_4_ = fStack_7b4 * fVar289;
      auVar59._16_4_ = fStack_7b0 * fVar316;
      auVar59._20_4_ = fStack_7ac * fVar398;
      auVar59._24_4_ = fStack_7a8 * fVar23;
      auVar59._28_4_ = uVar1;
      auVar18 = vsubps_avx(auVar354,auVar59);
      auVar354 = vrcpps_avx(auVar18);
      fVar233 = auVar354._0_4_;
      fVar234 = auVar354._4_4_;
      auVar60._4_4_ = auVar18._4_4_ * fVar234;
      auVar60._0_4_ = auVar18._0_4_ * fVar233;
      fVar235 = auVar354._8_4_;
      auVar60._8_4_ = auVar18._8_4_ * fVar235;
      fVar251 = auVar354._12_4_;
      auVar60._12_4_ = auVar18._12_4_ * fVar251;
      fVar259 = auVar354._16_4_;
      auVar60._16_4_ = auVar18._16_4_ * fVar259;
      fVar262 = auVar354._20_4_;
      auVar60._20_4_ = auVar18._20_4_ * fVar262;
      fVar265 = auVar354._24_4_;
      auVar60._24_4_ = auVar18._24_4_ * fVar265;
      auVar60._28_4_ = local_a20._28_4_;
      auVar24 = vsubps_avx(auVar249,auVar60);
      auVar121._8_4_ = 0x7fffffff;
      auVar121._0_8_ = 0x7fffffff7fffffff;
      auVar121._12_4_ = 0x7fffffff;
      auVar121._16_4_ = 0x7fffffff;
      auVar121._20_4_ = 0x7fffffff;
      auVar121._24_4_ = 0x7fffffff;
      auVar121._28_4_ = 0x7fffffff;
      auVar354 = vandps_avx(auVar18,auVar121);
      auVar15 = vcmpps_avx(auVar354,auVar368,1);
      auVar61._4_4_ = (fVar234 + fVar234 * auVar24._4_4_) * -auVar308._4_4_;
      auVar61._0_4_ = (fVar233 + fVar233 * auVar24._0_4_) * -auVar308._0_4_;
      auVar61._8_4_ = (fVar235 + fVar235 * auVar24._8_4_) * -auVar308._8_4_;
      auVar61._12_4_ = (fVar251 + fVar251 * auVar24._12_4_) * -auVar308._12_4_;
      auVar61._16_4_ = (fVar259 + fVar259 * auVar24._16_4_) * -auVar308._16_4_;
      auVar61._20_4_ = (fVar262 + fVar262 * auVar24._20_4_) * -auVar308._20_4_;
      auVar61._24_4_ = (fVar265 + fVar265 * auVar24._24_4_) * -auVar308._24_4_;
      auVar61._28_4_ = auVar308._28_4_ ^ 0x80000000;
      auVar354 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,1);
      auVar354 = vorps_avx(auVar15,auVar354);
      auVar354 = vblendvps_avx(auVar61,auVar385,auVar354);
      local_640 = vmaxps_avx(auVar17,auVar354);
      auVar354 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,6);
      auVar354 = vorps_avx(auVar15,auVar354);
      auVar354 = vblendvps_avx(auVar61,auVar391,auVar354);
      auVar114 = vandps_avx(auVar114,local_4c0);
      local_440 = vminps_avx(auVar405,auVar354);
      auVar354 = vcmpps_avx(local_640,local_440,2);
      auVar15 = auVar114 & auVar354;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar15 >> 0x7f,0) == '\0') &&
            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar15 >> 0xbf,0) == '\0') &&
          (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      {
        auVar311 = ZEXT3264(_local_9a0);
LAB_010befb8:
        auVar250 = ZEXT3264(auVar249);
      }
      else {
        auVar15 = vminps_avx(local_740,local_7a0);
        auVar405 = vminps_avx(local_760,local_780);
        auVar15 = vminps_avx(auVar15,auVar405);
        auVar14 = vsubps_avx(auVar15,auVar14);
        auVar114 = vandps_avx(auVar354,auVar114);
        auVar92._4_4_ = local_500[1];
        auVar92._0_4_ = local_500[0];
        auVar92._8_4_ = local_500[2];
        auVar92._12_4_ = local_500[3];
        auVar92._16_4_ = fStack_4f0;
        auVar92._20_4_ = fStack_4ec;
        auVar92._24_4_ = fStack_4e8;
        auVar92._28_4_ = fStack_4e4;
        auVar354 = vminps_avx(auVar92,auVar249);
        auVar354 = vmaxps_avx(auVar354,ZEXT832(0) << 0x20);
        local_500[0] = fVar100 + fVar145 * (auVar354._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar128 + fVar183 * (auVar354._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar131 + fVar184 * (auVar354._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar134 + fVar186 * (auVar354._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar100 + fVar145 * (auVar354._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar128 + fVar183 * (auVar354._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar131 + fVar184 * (auVar354._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar134 + auVar354._28_4_ + 7.0;
        auVar91._4_4_ = local_520[1];
        auVar91._0_4_ = local_520[0];
        auVar91._8_4_ = local_520[2];
        auVar91._12_4_ = local_520[3];
        auVar91._16_4_ = fStack_510;
        auVar91._20_4_ = fStack_50c;
        auVar91._24_4_ = fStack_508;
        auVar91._28_4_ = fStack_504;
        auVar354 = vminps_avx(auVar91,auVar249);
        auVar354 = vmaxps_avx(auVar354,ZEXT832(0) << 0x20);
        local_520[0] = fVar100 + fVar145 * (auVar354._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar128 + fVar183 * (auVar354._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar131 + fVar184 * (auVar354._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar134 + fVar186 * (auVar354._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar100 + fVar145 * (auVar354._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar128 + fVar183 * (auVar354._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar131 + fVar184 * (auVar354._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar134 + auVar354._28_4_ + 7.0;
        auVar62._4_4_ = auVar14._4_4_ * 0.99999976;
        auVar62._0_4_ = auVar14._0_4_ * 0.99999976;
        auVar62._8_4_ = auVar14._8_4_ * 0.99999976;
        auVar62._12_4_ = auVar14._12_4_ * 0.99999976;
        auVar62._16_4_ = auVar14._16_4_ * 0.99999976;
        auVar62._20_4_ = auVar14._20_4_ * 0.99999976;
        auVar62._24_4_ = auVar14._24_4_ * 0.99999976;
        auVar62._28_4_ = 0x3f7ffffc;
        auVar354 = vmaxps_avx(ZEXT832(0) << 0x20,auVar62);
        auVar63._4_4_ = auVar354._4_4_ * auVar354._4_4_;
        auVar63._0_4_ = auVar354._0_4_ * auVar354._0_4_;
        auVar63._8_4_ = auVar354._8_4_ * auVar354._8_4_;
        auVar63._12_4_ = auVar354._12_4_ * auVar354._12_4_;
        auVar63._16_4_ = auVar354._16_4_ * auVar354._16_4_;
        auVar63._20_4_ = auVar354._20_4_ * auVar354._20_4_;
        auVar63._24_4_ = auVar354._24_4_ * auVar354._24_4_;
        auVar63._28_4_ = auVar354._28_4_;
        local_ae0 = vsubps_avx(local_620,auVar63);
        auVar64._4_4_ = local_ae0._4_4_ * fVar185 * 4.0;
        auVar64._0_4_ = local_ae0._0_4_ * fVar264 * 4.0;
        auVar64._8_4_ = local_ae0._8_4_ * fVar187 * 4.0;
        auVar64._12_4_ = local_ae0._12_4_ * fVar188 * 4.0;
        auVar64._16_4_ = local_ae0._16_4_ * fVar189 * 4.0;
        auVar64._20_4_ = local_ae0._20_4_ * fVar190 * 4.0;
        auVar64._24_4_ = local_ae0._24_4_ * fVar369 * 4.0;
        auVar64._28_4_ = auVar354._28_4_;
        auVar14 = vsubps_avx(auVar46,auVar64);
        local_8e0 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
        auVar354 = local_8e0;
        if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8e0 >> 0x7f,0) == '\0') &&
              (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0xbf,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8e0[0x1f]) {
          _local_8a0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_840 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar218 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar245 = ZEXT828(0) << 0x20;
          auVar364 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar169._8_4_ = 0x7f800000;
          auVar169._0_8_ = 0x7f8000007f800000;
          auVar169._12_4_ = 0x7f800000;
          auVar169._16_4_ = 0x7f800000;
          auVar169._20_4_ = 0x7f800000;
          auVar169._24_4_ = 0x7f800000;
          auVar169._28_4_ = 0x7f800000;
          auVar277._8_4_ = 0xff800000;
          auVar277._0_8_ = 0xff800000ff800000;
          auVar277._12_4_ = 0xff800000;
          auVar277._16_4_ = 0xff800000;
          auVar277._20_4_ = 0xff800000;
          auVar277._24_4_ = 0xff800000;
          auVar277._28_4_ = 0xff800000;
          local_ae0 = auVar16;
          local_8e0 = auVar26;
          _local_880 = _local_8a0;
        }
        else {
          auVar16 = vsqrtps_avx(auVar14);
          auVar170._0_4_ = fVar264 + fVar264;
          auVar170._4_4_ = fVar185 + fVar185;
          auVar170._8_4_ = fVar187 + fVar187;
          auVar170._12_4_ = fVar188 + fVar188;
          auVar170._16_4_ = fVar189 + fVar189;
          auVar170._20_4_ = fVar190 + fVar190;
          auVar170._24_4_ = fVar369 + fVar369;
          auVar170._28_4_ = fVar229 + fVar229;
          auVar15 = vrcpps_avx(auVar170);
          fVar229 = auVar15._0_4_;
          fVar233 = auVar15._4_4_;
          auVar65._4_4_ = auVar170._4_4_ * fVar233;
          auVar65._0_4_ = auVar170._0_4_ * fVar229;
          fVar234 = auVar15._8_4_;
          auVar65._8_4_ = auVar170._8_4_ * fVar234;
          fVar235 = auVar15._12_4_;
          auVar65._12_4_ = auVar170._12_4_ * fVar235;
          fVar251 = auVar15._16_4_;
          auVar65._16_4_ = auVar170._16_4_ * fVar251;
          fVar259 = auVar15._20_4_;
          auVar65._20_4_ = auVar170._20_4_ * fVar259;
          fVar262 = auVar15._24_4_;
          auVar65._24_4_ = auVar170._24_4_ * fVar262;
          auVar65._28_4_ = auVar170._28_4_;
          auVar405 = vsubps_avx(auVar249,auVar65);
          fVar229 = fVar229 + fVar229 * auVar405._0_4_;
          fVar233 = fVar233 + fVar233 * auVar405._4_4_;
          fVar234 = fVar234 + fVar234 * auVar405._8_4_;
          fVar235 = fVar235 + fVar235 * auVar405._12_4_;
          fVar251 = fVar251 + fVar251 * auVar405._16_4_;
          fVar259 = fVar259 + fVar259 * auVar405._20_4_;
          fVar262 = fVar262 + fVar262 * auVar405._24_4_;
          fVar289 = auVar15._28_4_ + auVar405._28_4_;
          auVar171._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
          auVar171._8_4_ = -local_5c0._8_4_;
          auVar171._12_4_ = -local_5c0._12_4_;
          auVar171._16_4_ = -local_5c0._16_4_;
          auVar171._20_4_ = -local_5c0._20_4_;
          auVar171._24_4_ = -local_5c0._24_4_;
          auVar171._28_4_ = -local_5c0._28_4_;
          auVar15 = vsubps_avx(auVar171,auVar16);
          fVar265 = auVar15._0_4_ * fVar229;
          fVar284 = auVar15._4_4_ * fVar233;
          auVar66._4_4_ = fVar284;
          auVar66._0_4_ = fVar265;
          fVar292 = auVar15._8_4_ * fVar234;
          auVar66._8_4_ = fVar292;
          fVar294 = auVar15._12_4_ * fVar235;
          auVar66._12_4_ = fVar294;
          fVar257 = auVar15._16_4_ * fVar251;
          auVar66._16_4_ = fVar257;
          fVar260 = auVar15._20_4_ * fVar259;
          auVar66._20_4_ = fVar260;
          fVar287 = auVar15._24_4_ * fVar262;
          auVar66._24_4_ = fVar287;
          auVar66._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(auVar16,local_5c0);
          fVar229 = auVar15._0_4_ * fVar229;
          fVar233 = auVar15._4_4_ * fVar233;
          auVar67._4_4_ = fVar233;
          auVar67._0_4_ = fVar229;
          fVar234 = auVar15._8_4_ * fVar234;
          auVar67._8_4_ = fVar234;
          fVar235 = auVar15._12_4_ * fVar235;
          auVar67._12_4_ = fVar235;
          fVar251 = auVar15._16_4_ * fVar251;
          auVar67._16_4_ = fVar251;
          fVar259 = auVar15._20_4_ * fVar259;
          auVar67._20_4_ = fVar259;
          fVar262 = auVar15._24_4_ * fVar262;
          auVar67._24_4_ = fVar262;
          auVar67._28_4_ = auVar114._28_4_;
          auVar13._4_4_ = fStack_3fc;
          auVar13._0_4_ = local_400;
          auVar13._8_4_ = fStack_3f8;
          auVar13._12_4_ = fStack_3f4;
          auVar13._16_4_ = fStack_3f0;
          auVar13._20_4_ = fStack_3ec;
          auVar13._24_4_ = fStack_3e8;
          auVar13._28_4_ = fStack_3e4;
          fVar291 = local_400 * (fVar265 * fVar350 + fVar370);
          fVar293 = fStack_3fc * (fVar284 * fVar356 + fVar374);
          fVar314 = fStack_3f8 * (fVar292 * fVar357 + fVar375);
          fVar316 = fStack_3f4 * (fVar294 * fVar358 + fVar376);
          fVar318 = fStack_3f0 * (fVar257 * fVar359 + fVar377);
          fVar320 = fStack_3ec * (fVar260 * fVar360 + fVar378);
          fVar296 = fStack_3e8 * (fVar287 * fVar361 + fVar379);
          auVar226._0_4_ = fVar101 + fVar232 * fVar291;
          auVar226._4_4_ = fVar129 + fVar256 * fVar293;
          auVar226._8_4_ = fVar132 + fVar290 * fVar314;
          auVar226._12_4_ = fVar135 + fVar285 * fVar316;
          auVar226._16_4_ = fVar137 + fVar312 * fVar318;
          auVar226._20_4_ = fVar139 + fVar419 * fVar320;
          auVar226._24_4_ = fVar141 + fVar21 * fVar296;
          auVar226._28_4_ = fVar143 + auVar15._28_4_ + fVar380;
          auVar68._4_4_ = (float)local_7c0._4_4_ * fVar284;
          auVar68._0_4_ = (float)local_7c0._0_4_ * fVar265;
          auVar68._8_4_ = fStack_7b8 * fVar292;
          auVar68._12_4_ = fStack_7b4 * fVar294;
          auVar68._16_4_ = fStack_7b0 * fVar257;
          auVar68._20_4_ = fStack_7ac * fVar260;
          auVar68._24_4_ = fStack_7a8 * fVar287;
          auVar68._28_4_ = fVar289;
          local_a40 = vsubps_avx(auVar68,auVar226);
          auVar247._0_4_ = fVar102 + fVar230 * fVar291;
          auVar247._4_4_ = fVar130 + fVar252 * fVar293;
          auVar247._8_4_ = fVar133 + fVar286 * fVar314;
          auVar247._12_4_ = fVar136 + fVar263 * fVar316;
          auVar247._16_4_ = fVar138 + fVar295 * fVar318;
          auVar247._20_4_ = fVar140 + fVar322 * fVar320;
          auVar247._24_4_ = fVar142 + fVar19 * fVar296;
          auVar247._28_4_ = fVar144 + fVar289;
          auVar69._4_4_ = (float)local_7e0._4_4_ * fVar284;
          auVar69._0_4_ = (float)local_7e0._0_4_ * fVar265;
          auVar69._8_4_ = fStack_7d8 * fVar292;
          auVar69._12_4_ = fStack_7d4 * fVar294;
          auVar69._16_4_ = fStack_7d0 * fVar257;
          auVar69._20_4_ = fStack_7cc * fVar260;
          auVar69._24_4_ = fStack_7c8 * fVar287;
          auVar69._28_4_ = fVar134;
          _local_9c0 = vsubps_avx(auVar69,auVar247);
          auVar278._0_4_ = local_540._0_4_ + fVar231 * fVar291;
          auVar278._4_4_ = local_540._4_4_ + fVar254 * fVar293;
          auVar278._8_4_ = local_540._8_4_ + fVar288 * fVar314;
          auVar278._12_4_ = local_540._12_4_ + fVar266 * fVar316;
          auVar278._16_4_ = local_540._16_4_ + fVar297 * fVar318;
          auVar278._20_4_ = local_540._20_4_ + fVar387 * fVar320;
          auVar278._24_4_ = local_540._24_4_ + fVar20 * fVar296;
          auVar278._28_4_ = local_540._28_4_ + 0.0;
          auVar70._4_4_ = (float)local_800._4_4_ * fVar284;
          auVar70._0_4_ = (float)local_800._0_4_ * fVar265;
          auVar70._8_4_ = fStack_7f8 * fVar292;
          auVar70._12_4_ = fStack_7f4 * fVar294;
          auVar70._16_4_ = fStack_7f0 * fVar257;
          auVar70._20_4_ = fStack_7ec * fVar260;
          auVar70._24_4_ = fStack_7e8 * fVar287;
          auVar70._28_4_ = fVar134;
          local_b00 = vsubps_avx(auVar70,auVar278);
          fVar265 = local_400 * (fVar229 * fVar350 + fVar370);
          fVar284 = fStack_3fc * (fVar233 * fVar356 + fVar374);
          fVar292 = fStack_3f8 * (fVar234 * fVar357 + fVar375);
          fVar294 = fStack_3f4 * (fVar235 * fVar358 + fVar376);
          fVar257 = fStack_3f0 * (fVar251 * fVar359 + fVar377);
          fVar260 = fStack_3ec * (fVar259 * fVar360 + fVar378);
          fVar287 = fStack_3e8 * (fVar262 * fVar361 + fVar379);
          auVar309._0_4_ = fVar101 + fVar232 * fVar265;
          auVar309._4_4_ = fVar129 + fVar256 * fVar284;
          auVar309._8_4_ = fVar132 + fVar290 * fVar292;
          auVar309._12_4_ = fVar135 + fVar285 * fVar294;
          auVar309._16_4_ = fVar137 + fVar312 * fVar257;
          auVar309._20_4_ = fVar139 + fVar419 * fVar260;
          auVar309._24_4_ = fVar141 + fVar21 * fVar287;
          auVar309._28_4_ = fVar143 + fVar134;
          auVar71._4_4_ = fVar233 * (float)local_7c0._4_4_;
          auVar71._0_4_ = fVar229 * (float)local_7c0._0_4_;
          auVar71._8_4_ = fVar234 * fStack_7b8;
          auVar71._12_4_ = fVar235 * fStack_7b4;
          auVar71._16_4_ = fVar251 * fStack_7b0;
          auVar71._20_4_ = fVar259 * fStack_7ac;
          auVar71._24_4_ = fVar262 * fStack_7a8;
          auVar71._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar71,auVar309);
          auVar310._0_4_ = fVar102 + fVar230 * fVar265;
          auVar310._4_4_ = fVar130 + fVar252 * fVar284;
          auVar310._8_4_ = fVar133 + fVar286 * fVar292;
          auVar310._12_4_ = fVar136 + fVar263 * fVar294;
          auVar310._16_4_ = fVar138 + fVar295 * fVar257;
          auVar310._20_4_ = fVar140 + fVar322 * fVar260;
          auVar310._24_4_ = fVar142 + fVar19 * fVar287;
          auVar310._28_4_ = fVar144 + local_880._28_4_;
          auVar72._4_4_ = (float)local_7e0._4_4_ * fVar233;
          auVar72._0_4_ = (float)local_7e0._0_4_ * fVar229;
          auVar72._8_4_ = fStack_7d8 * fVar234;
          auVar72._12_4_ = fStack_7d4 * fVar235;
          auVar72._16_4_ = fStack_7d0 * fVar251;
          auVar72._20_4_ = fStack_7cc * fVar259;
          auVar72._24_4_ = fStack_7c8 * fVar262;
          auVar72._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar72,auVar310);
          auVar279._0_4_ = local_540._0_4_ + fVar231 * fVar265;
          auVar279._4_4_ = local_540._4_4_ + fVar254 * fVar284;
          auVar279._8_4_ = local_540._8_4_ + fVar288 * fVar292;
          auVar279._12_4_ = local_540._12_4_ + fVar266 * fVar294;
          auVar279._16_4_ = local_540._16_4_ + fVar297 * fVar257;
          auVar279._20_4_ = local_540._20_4_ + fVar387 * fVar260;
          auVar279._24_4_ = local_540._24_4_ + fVar20 * fVar287;
          auVar279._28_4_ = local_540._28_4_ + local_b00._28_4_ + fVar380;
          auVar73._4_4_ = (float)local_800._4_4_ * fVar233;
          auVar73._0_4_ = (float)local_800._0_4_ * fVar229;
          auVar73._8_4_ = fStack_7f8 * fVar234;
          auVar73._12_4_ = fStack_7f4 * fVar235;
          auVar73._16_4_ = fStack_7f0 * fVar251;
          auVar73._20_4_ = fStack_7ec * fVar259;
          auVar73._24_4_ = fStack_7e8 * fVar262;
          auVar73._28_4_ = local_8a0._28_4_;
          _local_840 = vsubps_avx(auVar73,auVar279);
          auVar15 = vcmpps_avx(auVar14,_DAT_02020f00,5);
          auVar280._8_4_ = 0x7f800000;
          auVar280._0_8_ = 0x7f8000007f800000;
          auVar280._12_4_ = 0x7f800000;
          auVar280._16_4_ = 0x7f800000;
          auVar280._20_4_ = 0x7f800000;
          auVar280._24_4_ = 0x7f800000;
          auVar280._28_4_ = 0x7f800000;
          auVar169 = vblendvps_avx(auVar280,auVar66,auVar15);
          auVar336._8_4_ = 0x7fffffff;
          auVar336._0_8_ = 0x7fffffff7fffffff;
          auVar336._12_4_ = 0x7fffffff;
          auVar336._16_4_ = 0x7fffffff;
          auVar336._20_4_ = 0x7fffffff;
          auVar336._24_4_ = 0x7fffffff;
          auVar336._28_4_ = 0x7fffffff;
          auVar14 = vandps_avx(auVar336,local_420);
          auVar14 = vmaxps_avx(local_4e0,auVar14);
          auVar74._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar74._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar74._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar74._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar74._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar74._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar74._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar74._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar336,local_660);
          auVar14 = vcmpps_avx(auVar14,auVar74,1);
          auVar281._8_4_ = 0xff800000;
          auVar281._0_8_ = 0xff800000ff800000;
          auVar281._12_4_ = 0xff800000;
          auVar281._16_4_ = 0xff800000;
          auVar281._20_4_ = 0xff800000;
          auVar281._24_4_ = 0xff800000;
          auVar281._28_4_ = 0xff800000;
          auVar277 = vblendvps_avx(auVar281,auVar67,auVar15);
          auVar16 = auVar15 & auVar14;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar354 = vandps_avx(auVar14,auVar15);
            auVar148 = vpackssdw_avx(auVar354._0_16_,auVar354._16_16_);
            auVar405 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar16 = vcmpps_avx(local_ae0,auVar405,2);
            auVar423._8_4_ = 0xff800000;
            auVar423._0_8_ = 0xff800000ff800000;
            auVar423._12_4_ = 0xff800000;
            auVar423._16_4_ = 0xff800000;
            auVar423._20_4_ = 0xff800000;
            auVar423._24_4_ = 0xff800000;
            auVar423._28_4_ = 0xff800000;
            auVar425._8_4_ = 0x7f800000;
            auVar425._0_8_ = 0x7f8000007f800000;
            auVar425._12_4_ = 0x7f800000;
            auVar425._16_4_ = 0x7f800000;
            auVar425._20_4_ = 0x7f800000;
            auVar425._24_4_ = 0x7f800000;
            auVar425._28_4_ = 0x7f800000;
            auVar14 = vblendvps_avx(auVar425,auVar423,auVar16);
            auVar214 = vpmovsxwd_avx(auVar148);
            auVar148 = vpunpckhwd_avx(auVar148,auVar148);
            auVar337._16_16_ = auVar148;
            auVar337._0_16_ = auVar214;
            auVar169 = vblendvps_avx(auVar169,auVar14,auVar337);
            auVar13 = vblendvps_avx(auVar423,auVar425,auVar16);
            auVar277 = vblendvps_avx(auVar277,auVar13,auVar337);
            auVar14 = vcmpps_avx(auVar405,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar207._0_4_ = auVar354._0_4_ ^ auVar14._0_4_;
            auVar207._4_4_ = auVar354._4_4_ ^ auVar14._4_4_;
            auVar207._8_4_ = auVar354._8_4_ ^ auVar14._8_4_;
            auVar207._12_4_ = auVar354._12_4_ ^ auVar14._12_4_;
            auVar207._16_4_ = auVar354._16_4_ ^ auVar14._16_4_;
            auVar207._20_4_ = auVar354._20_4_ ^ auVar14._20_4_;
            auVar207._24_4_ = auVar354._24_4_ ^ auVar14._24_4_;
            auVar207._28_4_ = auVar354._28_4_ ^ auVar14._28_4_;
            auVar354 = vorps_avx(auVar16,auVar207);
            auVar354 = vandps_avx(auVar15,auVar354);
          }
          auVar386 = ZEXT3264(auVar13);
          auVar218 = local_a40._0_28_;
          auVar245 = local_9c0._0_28_;
          auVar364 = local_b00._0_28_;
        }
        auVar311 = ZEXT3264(_local_9a0);
        _local_4a0 = local_640;
        local_480 = vminps_avx(local_440,auVar169);
        _local_460 = vmaxps_avx(local_640,auVar277);
        auVar14 = vcmpps_avx(local_640,local_480,2);
        local_540 = vandps_avx(auVar114,auVar14);
        local_5e0 = local_540;
        auVar14 = vcmpps_avx(_local_460,local_440,2);
        local_600 = vandps_avx(auVar114,auVar14);
        auVar114 = vorps_avx(local_600,local_540);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_580 = local_600;
          local_860 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5c0._0_4_ = auVar354._0_4_ ^ local_860._0_4_;
          local_5c0._4_4_ = auVar354._4_4_ ^ local_860._4_4_;
          local_5c0._8_4_ = (float)(auVar354._8_4_ ^ local_860._8_4_);
          local_5c0._12_4_ = (float)(auVar354._12_4_ ^ local_860._12_4_);
          local_5c0._16_4_ = (float)(auVar354._16_4_ ^ local_860._16_4_);
          local_5c0._20_4_ = (float)(auVar354._20_4_ ^ local_860._20_4_);
          local_5c0._24_4_ = (float)(auVar354._24_4_ ^ local_860._24_4_);
          local_5c0._28_4_ = (float)((uint)auVar354._28_4_ ^ (uint)local_860._28_4_);
          auVar123._0_4_ =
               auVar218._0_4_ * (float)local_7c0._0_4_ +
               auVar245._0_4_ * (float)local_7e0._0_4_ + auVar364._0_4_ * (float)local_800._0_4_;
          auVar123._4_4_ =
               auVar218._4_4_ * (float)local_7c0._4_4_ +
               auVar245._4_4_ * (float)local_7e0._4_4_ + auVar364._4_4_ * (float)local_800._4_4_;
          auVar123._8_4_ =
               auVar218._8_4_ * fStack_7b8 +
               auVar245._8_4_ * fStack_7d8 + auVar364._8_4_ * fStack_7f8;
          auVar123._12_4_ =
               auVar218._12_4_ * fStack_7b4 +
               auVar245._12_4_ * fStack_7d4 + auVar364._12_4_ * fStack_7f4;
          auVar123._16_4_ =
               auVar218._16_4_ * fStack_7b0 +
               auVar245._16_4_ * fStack_7d0 + auVar364._16_4_ * fStack_7f0;
          auVar123._20_4_ =
               auVar218._20_4_ * fStack_7ac +
               auVar245._20_4_ * fStack_7cc + auVar364._20_4_ * fStack_7ec;
          auVar123._24_4_ =
               auVar218._24_4_ * fStack_7a8 +
               auVar245._24_4_ * fStack_7c8 + auVar364._24_4_ * fStack_7e8;
          auVar123._28_4_ = local_860._28_4_ + local_540._28_4_ + auVar354._28_4_;
          auVar172._8_4_ = 0x7fffffff;
          auVar172._0_8_ = 0x7fffffff7fffffff;
          auVar172._12_4_ = 0x7fffffff;
          auVar172._16_4_ = 0x7fffffff;
          auVar172._20_4_ = 0x7fffffff;
          auVar172._24_4_ = 0x7fffffff;
          auVar172._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar123,auVar172);
          auVar173._8_4_ = 0x3e99999a;
          auVar173._0_8_ = 0x3e99999a3e99999a;
          auVar173._12_4_ = 0x3e99999a;
          auVar173._16_4_ = 0x3e99999a;
          auVar173._20_4_ = 0x3e99999a;
          auVar173._24_4_ = 0x3e99999a;
          auVar173._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar173,1);
          auVar114 = vorps_avx(auVar114,local_5c0);
          auVar174._8_4_ = 3;
          auVar174._0_8_ = 0x300000003;
          auVar174._12_4_ = 3;
          auVar174._16_4_ = 3;
          auVar174._20_4_ = 3;
          auVar174._24_4_ = 3;
          auVar174._28_4_ = 3;
          auVar202._8_4_ = 2;
          auVar202._0_8_ = 0x200000002;
          auVar202._12_4_ = 2;
          auVar202._16_4_ = 2;
          auVar202._20_4_ = 2;
          auVar202._24_4_ = 2;
          auVar202._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar202,auVar174,auVar114);
          local_5a0 = ZEXT432((uint)uVar95);
          auVar214 = vpshufd_avx(ZEXT416((uint)uVar95),0);
          auVar148 = vpcmpgtd_avx(auVar114._16_16_,auVar214);
          local_660._0_16_ = auVar214;
          auVar214 = vpcmpgtd_avx(auVar114._0_16_,auVar214);
          auVar175._16_16_ = auVar148;
          auVar175._0_16_ = auVar214;
          local_560 = vblendps_avx(ZEXT1632(auVar214),auVar175,0xf0);
          local_5e0 = vandnps_avx(local_560,local_540);
          auVar114 = local_540 & ~local_560;
          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar95;
          auVar354 = _local_460;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            local_820._4_4_ = local_640._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = local_640._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = local_640._8_4_ + fStack_998;
            fStack_814 = local_640._12_4_ + fStack_994;
            fStack_810 = local_640._16_4_ + fStack_990;
            fStack_80c = local_640._20_4_ + fStack_98c;
            fStack_808 = local_640._24_4_ + fStack_988;
            fStack_804 = local_640._28_4_ + fStack_984;
            local_9e0 = _local_460;
            do {
              auVar237 = auVar228._0_16_;
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar114 = vblendvps_avx(auVar176,local_640,local_5e0);
              auVar354 = vshufps_avx(auVar114,auVar114,0xb1);
              auVar354 = vminps_avx(auVar114,auVar354);
              auVar14 = vshufpd_avx(auVar354,auVar354,5);
              auVar354 = vminps_avx(auVar354,auVar14);
              auVar14 = vperm2f128_avx(auVar354,auVar354,1);
              auVar354 = vminps_avx(auVar354,auVar14);
              auVar354 = vcmpps_avx(auVar114,auVar354,0);
              auVar14 = local_5e0 & auVar354;
              auVar114 = local_5e0;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar354,local_5e0);
              }
              uVar96 = vmovmskps_avx(auVar114);
              uVar11 = 0;
              if (uVar96 != 0) {
                for (; (uVar96 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar95 = (ulong)uVar11;
              *(undefined4 *)(local_5e0 + uVar95 * 4) = 0;
              fVar229 = local_500[uVar95];
              uVar11 = *(uint *)(local_4a0 + uVar95 * 4);
              fVar230 = local_b04;
              if ((float)local_940._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_940._0_4_);
                auVar237._8_4_ = 0x7fffffff;
                auVar237._0_8_ = 0x7fffffff7fffffff;
                auVar237._12_4_ = 0x7fffffff;
              }
              auVar250 = ZEXT464(uVar11);
              auVar214 = vminps_avx(_local_a80,_local_aa0);
              auVar148 = vmaxps_avx(_local_a80,_local_aa0);
              auVar106 = vminps_avx(_local_a90,_local_ab0);
              auVar192 = vminps_avx(auVar214,auVar106);
              auVar214 = vmaxps_avx(_local_a90,_local_ab0);
              auVar106 = vmaxps_avx(auVar148,auVar214);
              auVar148 = vandps_avx(auVar192,auVar237);
              auVar214 = vandps_avx(auVar106,auVar237);
              auVar148 = vmaxps_avx(auVar148,auVar214);
              auVar214 = vmovshdup_avx(auVar148);
              auVar214 = vmaxss_avx(auVar214,auVar148);
              auVar148 = vshufpd_avx(auVar148,auVar148,1);
              auVar148 = vmaxss_avx(auVar148,auVar214);
              local_a40._0_4_ = auVar148._0_4_ * 1.9073486e-06;
              local_900._0_4_ = fVar230 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar106,auVar106,0xff);
              lVar97 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar229;
                auVar148 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                fVar230 = auVar148._0_4_;
                fVar231 = auVar148._4_4_;
                fVar232 = auVar148._8_4_;
                fVar233 = auVar148._12_4_;
                auVar148 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar234 = auVar148._0_4_;
                fVar235 = auVar148._4_4_;
                fVar251 = auVar148._8_4_;
                fVar252 = auVar148._12_4_;
                fVar254 = (float)local_a90._0_4_ * fVar230 + (float)local_aa0._0_4_ * fVar234;
                fVar256 = (float)local_a90._4_4_ * fVar231 + (float)local_aa0._4_4_ * fVar235;
                fVar259 = fStack_a88 * fVar232 + fStack_a98 * fVar251;
                fVar262 = fStack_a84 * fVar233 + fStack_a94 * fVar252;
                auVar269._0_4_ =
                     fVar234 * ((float)local_aa0._0_4_ * fVar230 + fVar234 * (float)local_a80._0_4_)
                     + fVar230 * fVar254;
                auVar269._4_4_ =
                     fVar235 * ((float)local_aa0._4_4_ * fVar231 + fVar235 * (float)local_a80._4_4_)
                     + fVar231 * fVar256;
                auVar269._8_4_ =
                     fVar251 * (fStack_a98 * fVar232 + fVar251 * fStack_a78) + fVar232 * fVar259;
                auVar269._12_4_ =
                     fVar252 * (fStack_a94 * fVar233 + fVar252 * fStack_a74) + fVar233 * fVar262;
                auVar210._0_4_ =
                     fVar234 * fVar254 +
                     fVar230 * (fVar230 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar234)
                ;
                auVar210._4_4_ =
                     fVar235 * fVar256 +
                     fVar231 * (fVar231 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar235)
                ;
                auVar210._8_4_ =
                     fVar251 * fVar259 + fVar232 * (fVar232 * fStack_aa8 + fStack_a88 * fVar251);
                auVar210._12_4_ =
                     fVar252 * fVar262 + fVar233 * (fVar233 * fStack_aa4 + fStack_a84 * fVar252);
                auVar148 = vshufps_avx(auVar250._0_16_,auVar250._0_16_,0);
                auVar149._0_4_ = auVar148._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar149._4_4_ = auVar148._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar149._8_4_ = auVar148._8_4_ * fStack_928 + 0.0;
                auVar149._12_4_ = auVar148._12_4_ * fStack_924 + 0.0;
                auVar105._0_4_ = fVar234 * auVar269._0_4_ + fVar230 * auVar210._0_4_;
                auVar105._4_4_ = fVar235 * auVar269._4_4_ + fVar231 * auVar210._4_4_;
                auVar105._8_4_ = fVar251 * auVar269._8_4_ + fVar232 * auVar210._8_4_;
                auVar105._12_4_ = fVar252 * auVar269._12_4_ + fVar233 * auVar210._12_4_;
                local_8e0._0_16_ = auVar105;
                auVar148 = vsubps_avx(auVar149,auVar105);
                _local_9c0 = auVar148;
                auVar148 = vdpps_avx(auVar148,auVar148,0x7f);
                fVar230 = auVar148._0_4_;
                local_bc0 = auVar250._0_4_;
                if (fVar230 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ae0._0_16_ = auVar269;
                  local_960._0_16_ = auVar210;
                  fVar231 = sqrtf(fVar230);
                  auVar210 = local_960._0_16_;
                  auVar269 = local_ae0._0_16_;
                }
                else {
                  auVar214 = vsqrtss_avx(auVar148,auVar148);
                  fVar231 = auVar214._0_4_;
                }
                auVar214 = vsubps_avx(auVar210,auVar269);
                auVar300._0_4_ = auVar214._0_4_ * 3.0;
                auVar300._4_4_ = auVar214._4_4_ * 3.0;
                auVar300._8_4_ = auVar214._8_4_ * 3.0;
                auVar300._12_4_ = auVar214._12_4_ * 3.0;
                auVar214 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0))
                                       ,0);
                auVar106 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar229 + fVar229)) * 6.0));
                auVar192 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar229 -
                                          ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0))
                ;
                auVar211 = vshufps_avx(auVar106,auVar106,0);
                auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                     ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar106 = vdpps_avx(auVar300,auVar300,0x7f);
                auVar150._0_4_ =
                     auVar3._0_4_ * (float)local_a80._0_4_ +
                     auVar211._0_4_ * (float)local_aa0._0_4_ +
                     auVar214._0_4_ * (float)local_ab0._0_4_ +
                     auVar192._0_4_ * (float)local_a90._0_4_;
                auVar150._4_4_ =
                     auVar3._4_4_ * (float)local_a80._4_4_ +
                     auVar211._4_4_ * (float)local_aa0._4_4_ +
                     auVar214._4_4_ * (float)local_ab0._4_4_ +
                     auVar192._4_4_ * (float)local_a90._4_4_;
                auVar150._8_4_ =
                     auVar3._8_4_ * fStack_a78 +
                     auVar211._8_4_ * fStack_a98 +
                     auVar214._8_4_ * fStack_aa8 + auVar192._8_4_ * fStack_a88;
                auVar150._12_4_ =
                     auVar3._12_4_ * fStack_a74 +
                     auVar211._12_4_ * fStack_a94 +
                     auVar214._12_4_ * fStack_aa4 + auVar192._12_4_ * fStack_a84;
                auVar214 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
                auVar192 = vrsqrtss_avx(auVar214,auVar214);
                fVar233 = auVar192._0_4_;
                fVar232 = auVar106._0_4_;
                auVar192 = vdpps_avx(auVar300,auVar150,0x7f);
                auVar211 = vshufps_avx(auVar106,auVar106,0);
                auVar151._0_4_ = auVar150._0_4_ * auVar211._0_4_;
                auVar151._4_4_ = auVar150._4_4_ * auVar211._4_4_;
                auVar151._8_4_ = auVar150._8_4_ * auVar211._8_4_;
                auVar151._12_4_ = auVar150._12_4_ * auVar211._12_4_;
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                auVar238._0_4_ = auVar300._0_4_ * auVar192._0_4_;
                auVar238._4_4_ = auVar300._4_4_ * auVar192._4_4_;
                auVar238._8_4_ = auVar300._8_4_ * auVar192._8_4_;
                auVar238._12_4_ = auVar300._12_4_ * auVar192._12_4_;
                auVar3 = vsubps_avx(auVar151,auVar238);
                auVar192 = vrcpss_avx(auVar214,auVar214);
                auVar214 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_900._0_4_)));
                auVar192 = ZEXT416((uint)(auVar192._0_4_ * (2.0 - fVar232 * auVar192._0_4_)));
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                uVar95 = CONCAT44(auVar300._4_4_,auVar300._0_4_);
                local_a20._0_8_ = uVar95 ^ 0x8000000080000000;
                local_a20._8_4_ = -auVar300._8_4_;
                local_a20._12_4_ = -auVar300._12_4_;
                auVar211 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar232 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar211 = vshufps_avx(auVar211,auVar211,0);
                auVar212._0_4_ = auVar211._0_4_ * auVar3._0_4_ * auVar192._0_4_;
                auVar212._4_4_ = auVar211._4_4_ * auVar3._4_4_ * auVar192._4_4_;
                auVar212._8_4_ = auVar211._8_4_ * auVar3._8_4_ * auVar192._8_4_;
                auVar212._12_4_ = auVar211._12_4_ * auVar3._12_4_ * auVar192._12_4_;
                auVar363._0_4_ = auVar300._0_4_ * auVar211._0_4_;
                auVar363._4_4_ = auVar300._4_4_ * auVar211._4_4_;
                auVar363._8_4_ = auVar300._8_4_ * auVar211._8_4_;
                auVar363._12_4_ = auVar300._12_4_ * auVar211._12_4_;
                local_b00._0_16_ = auVar300;
                local_ae0._0_4_ = auVar214._0_4_;
                if (fVar232 < 0.0) {
                  local_960._0_4_ = fVar231;
                  local_980._0_16_ = auVar363;
                  local_920._0_16_ = auVar212;
                  fVar233 = sqrtf(fVar232);
                  auVar212 = local_920._0_16_;
                  auVar363 = local_980._0_16_;
                  fVar231 = (float)local_960._0_4_;
                  fVar232 = (float)local_ae0._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar233 = auVar106._0_4_;
                  fVar232 = auVar214._0_4_;
                }
                auVar214 = vdpps_avx(_local_9c0,auVar363,0x7f);
                local_960._0_4_ =
                     ((float)local_a40._0_4_ / fVar233) * (fVar231 + 1.0) +
                     fVar232 + fVar231 * (float)local_a40._0_4_;
                auVar106 = vdpps_avx(local_a20._0_16_,auVar363,0x7f);
                auVar192 = vdpps_avx(_local_9c0,auVar212,0x7f);
                auVar211 = vdpps_avx(_local_930,auVar363,0x7f);
                auVar3 = vdpps_avx(_local_9c0,local_a20._0_16_,0x7f);
                fVar231 = auVar106._0_4_ + auVar192._0_4_;
                fVar233 = auVar214._0_4_;
                auVar107._0_4_ = fVar233 * fVar233;
                auVar107._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                auVar107._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                auVar107._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                auVar192 = vsubps_avx(auVar148,auVar107);
                local_a20._0_16_ = ZEXT416((uint)fVar231);
                auVar106 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar234 = auVar3._0_4_ - fVar233 * fVar231;
                fVar233 = auVar106._0_4_ - fVar233 * auVar211._0_4_;
                auVar106 = vrsqrtss_avx(auVar192,auVar192);
                fVar235 = auVar192._0_4_;
                fVar231 = auVar106._0_4_;
                fVar231 = fVar231 * 1.5 + fVar235 * -0.5 * fVar231 * fVar231 * fVar231;
                if (fVar235 < 0.0) {
                  local_980._0_16_ = auVar214;
                  local_920._0_16_ = auVar211;
                  local_740._0_4_ = fVar234;
                  local_760._0_4_ = fVar233;
                  local_780._0_4_ = fVar231;
                  fVar235 = sqrtf(fVar235);
                  fVar231 = (float)local_780._0_4_;
                  fVar234 = (float)local_740._0_4_;
                  fVar233 = (float)local_760._0_4_;
                  auVar211 = local_920._0_16_;
                  auVar214 = local_980._0_16_;
                  fVar232 = (float)local_ae0._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar192,auVar192);
                  fVar235 = auVar106._0_4_;
                }
                auVar192 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar3 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar234 = fVar234 * fVar231 - auVar3._0_4_;
                auVar239._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = auVar211._8_4_ ^ 0x80000000;
                auVar239._12_4_ = auVar211._12_4_ ^ 0x80000000;
                auVar270._0_4_ = -fVar234;
                auVar270._4_4_ = 0x80000000;
                auVar270._8_4_ = 0x80000000;
                auVar270._12_4_ = 0x80000000;
                auVar386 = ZEXT1664(local_a20._0_16_);
                auVar106 = vinsertps_avx(ZEXT416((uint)(fVar233 * fVar231)),auVar239,0x10);
                auVar211 = vmovsldup_avx(ZEXT416((uint)(local_a20._0_4_ * fVar233 * fVar231 -
                                                       auVar211._0_4_ * fVar234)));
                auVar106 = vdivps_avx(auVar106,auVar211);
                auVar152 = ZEXT416((uint)(fVar235 - auVar192._0_4_));
                auVar192 = vinsertps_avx(auVar214,auVar152,0x10);
                auVar213._0_4_ = auVar192._0_4_ * auVar106._0_4_;
                auVar213._4_4_ = auVar192._4_4_ * auVar106._4_4_;
                auVar213._8_4_ = auVar192._8_4_ * auVar106._8_4_;
                auVar213._12_4_ = auVar192._12_4_ * auVar106._12_4_;
                auVar106 = vinsertps_avx(auVar270,local_a20._0_16_,0x1c);
                auVar106 = vdivps_avx(auVar106,auVar211);
                auVar193._0_4_ = auVar192._0_4_ * auVar106._0_4_;
                auVar193._4_4_ = auVar192._4_4_ * auVar106._4_4_;
                auVar193._8_4_ = auVar192._8_4_ * auVar106._8_4_;
                auVar193._12_4_ = auVar192._12_4_ * auVar106._12_4_;
                auVar106 = vhaddps_avx(auVar213,auVar213);
                auVar192 = vhaddps_avx(auVar193,auVar193);
                fVar229 = fVar229 - auVar106._0_4_;
                local_bc0 = local_bc0 - auVar192._0_4_;
                auVar250 = ZEXT464((uint)local_bc0);
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
                auVar228 = ZEXT1664(auVar240);
                auVar214 = vandps_avx(auVar214,auVar240);
                if ((float)local_960._0_4_ <= auVar214._0_4_) {
LAB_010bfda5:
                  bVar75 = false;
                }
                else {
                  auVar214 = vandps_avx(auVar152,auVar240);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar232 + (float)local_960._0_4_ <=
                      auVar214._0_4_) goto LAB_010bfda5;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar250 = ZEXT464((uint)local_bc0);
                  bVar75 = true;
                  if (((fVar208 <= local_bc0) &&
                      (fVar231 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar231)) &&
                     ((0.0 <= fVar229 && (fVar229 <= 1.0)))) {
                    auVar148 = vrsqrtss_avx(auVar148,auVar148);
                    fVar232 = auVar148._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar8].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar148 = ZEXT416((uint)(fVar232 * 1.5 +
                                               fVar230 * -0.5 * fVar232 * fVar232 * fVar232));
                      auVar148 = vshufps_avx(auVar148,auVar148,0);
                      auVar153._0_4_ = auVar148._0_4_ * (float)local_9c0._0_4_;
                      auVar153._4_4_ = auVar148._4_4_ * (float)local_9c0._4_4_;
                      auVar153._8_4_ = auVar148._8_4_ * fStack_9b8;
                      auVar153._12_4_ = auVar148._12_4_ * fStack_9b4;
                      auVar108._0_4_ = local_b00._0_4_ + auVar3._0_4_ * auVar153._0_4_;
                      auVar108._4_4_ = local_b00._4_4_ + auVar3._4_4_ * auVar153._4_4_;
                      auVar108._8_4_ = local_b00._8_4_ + auVar3._8_4_ * auVar153._8_4_;
                      auVar108._12_4_ = local_b00._12_4_ + auVar3._12_4_ * auVar153._12_4_;
                      auVar148 = vshufps_avx(auVar153,auVar153,0xc9);
                      auVar214 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar154._0_4_ = auVar214._0_4_ * auVar153._0_4_;
                      auVar154._4_4_ = auVar214._4_4_ * auVar153._4_4_;
                      auVar154._8_4_ = auVar214._8_4_ * auVar153._8_4_;
                      auVar154._12_4_ = auVar214._12_4_ * auVar153._12_4_;
                      auVar194._0_4_ = local_b00._0_4_ * auVar148._0_4_;
                      auVar194._4_4_ = local_b00._4_4_ * auVar148._4_4_;
                      auVar194._8_4_ = local_b00._8_4_ * auVar148._8_4_;
                      auVar194._12_4_ = local_b00._12_4_ * auVar148._12_4_;
                      auVar106 = vsubps_avx(auVar194,auVar154);
                      auVar148 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar214 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar195._0_4_ = auVar214._0_4_ * auVar148._0_4_;
                      auVar195._4_4_ = auVar214._4_4_ * auVar148._4_4_;
                      auVar195._8_4_ = auVar214._8_4_ * auVar148._8_4_;
                      auVar195._12_4_ = auVar214._12_4_ * auVar148._12_4_;
                      auVar148 = vshufps_avx(auVar106,auVar106,0xd2);
                      auVar109._0_4_ = auVar108._0_4_ * auVar148._0_4_;
                      auVar109._4_4_ = auVar108._4_4_ * auVar148._4_4_;
                      auVar109._8_4_ = auVar108._8_4_ * auVar148._8_4_;
                      auVar109._12_4_ = auVar108._12_4_ * auVar148._12_4_;
                      auVar148 = vsubps_avx(auVar195,auVar109);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar148,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar148,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar148._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar229;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(uint *)(ray + k * 4 + 0x110) = uVar94;
                        *(uint *)(ray + k * 4 + 0x120) = uVar8;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar148,auVar148,0x55);
                        auVar214 = vshufps_avx(auVar148,auVar148,0xaa);
                        local_6e0 = vshufps_avx(auVar148,auVar148,0);
                        auStack_6f0 = auVar214;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar11 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar11,uVar11);
                        _uStack_688 = CONCAT44(uVar11,uVar11);
                        uVar11 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar11,uVar11);
                        _uStack_678 = CONCAT44(uVar11,uVar11);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9f0;
                        uStack_b18 = local_9f0[1];
                        local_a70.valid = (int *)&local_b20;
                        local_a70.geometryUserPtr = pGVar9->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_700;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar386 = ZEXT1664(local_a20._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_a70);
                        }
                        auVar87._8_8_ = uStack_b18;
                        auVar87._0_8_ = local_b20;
                        if (auVar87 == (undefined1  [16])0x0) {
                          auVar148 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar148 = auVar148 ^ _DAT_01febe20;
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar386 = ZEXT1664(auVar386._0_16_);
                            (*p_Var10)(&local_a70);
                            auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar88._8_8_ = uStack_b18;
                          auVar88._0_8_ = local_b20;
                          auVar106 = vpcmpeqd_avx(auVar88,_DAT_01feba10);
                          auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                          auVar148 = auVar106 ^ auVar214;
                          if (auVar88 != (undefined1  [16])0x0) {
                            auVar106 = auVar106 ^ auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar214;
                          }
                        }
                        auVar250 = ZEXT464((uint)local_bc0);
                        auVar155._8_8_ = 0x100000001;
                        auVar155._0_8_ = 0x100000001;
                        if ((auVar155 & auVar148) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                        }
                      }
                    }
                  }
                }
                auVar114 = local_5e0;
                bVar99 = lVar97 != 0;
                lVar97 = lVar97 + -1;
              } while ((!bVar75) && (bVar99));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar124._4_4_ = uVar1;
              auVar124._0_4_ = uVar1;
              auVar124._8_4_ = uVar1;
              auVar124._12_4_ = uVar1;
              auVar124._16_4_ = uVar1;
              auVar124._20_4_ = uVar1;
              auVar124._24_4_ = uVar1;
              auVar124._28_4_ = uVar1;
              auVar354 = vcmpps_avx(_local_820,auVar124,2);
              local_5e0 = vandps_avx(auVar354,local_5e0);
              auVar114 = auVar114 & auVar354;
              uVar95 = local_620._0_8_;
              auVar354 = local_9e0;
            } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar114 >> 0x7f,0) != '\0') ||
                       (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0xbf,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar114[0x1f] < '\0');
          }
          auVar125._0_4_ =
               (float)local_880._0_4_ * (float)local_7c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_840._0_4_ * (float)local_800._0_4_;
          auVar125._4_4_ =
               (float)local_880._4_4_ * (float)local_7c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_840._4_4_ * (float)local_800._4_4_;
          auVar125._8_4_ =
               fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_838 * fStack_7f8;
          auVar125._12_4_ =
               fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_834 * fStack_7f4;
          auVar125._16_4_ =
               fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_830 * fStack_7f0;
          auVar125._20_4_ =
               fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_82c * fStack_7ec;
          auVar125._24_4_ =
               fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_828 * fStack_7e8;
          auVar125._28_4_ = fStack_864 + fStack_884 + fStack_824;
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar125,auVar177);
          auVar178._8_4_ = 0x3e99999a;
          auVar178._0_8_ = 0x3e99999a3e99999a;
          auVar178._12_4_ = 0x3e99999a;
          auVar178._16_4_ = 0x3e99999a;
          auVar178._20_4_ = 0x3e99999a;
          auVar178._24_4_ = 0x3e99999a;
          auVar178._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar178,1);
          auVar14 = vorps_avx(auVar114,local_5c0);
          auVar179._0_4_ = auVar354._0_4_ + (float)local_9a0._0_4_;
          auVar179._4_4_ = auVar354._4_4_ + (float)local_9a0._4_4_;
          auVar179._8_4_ = auVar354._8_4_ + fStack_998;
          auVar179._12_4_ = auVar354._12_4_ + fStack_994;
          auVar179._16_4_ = auVar354._16_4_ + fStack_990;
          auVar179._20_4_ = auVar354._20_4_ + fStack_98c;
          auVar179._24_4_ = auVar354._24_4_ + fStack_988;
          auVar179._28_4_ = auVar354._28_4_ + fStack_984;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar203._4_4_ = uVar1;
          auVar203._0_4_ = uVar1;
          auVar203._8_4_ = uVar1;
          auVar203._12_4_ = uVar1;
          auVar203._16_4_ = uVar1;
          auVar203._20_4_ = uVar1;
          auVar203._24_4_ = uVar1;
          auVar203._28_4_ = uVar1;
          auVar114 = vcmpps_avx(auVar179,auVar203,2);
          _local_880 = vandps_avx(auVar114,local_580);
          auVar180._8_4_ = 3;
          auVar180._0_8_ = 0x300000003;
          auVar180._12_4_ = 3;
          auVar180._16_4_ = 3;
          auVar180._20_4_ = 3;
          auVar180._24_4_ = 3;
          auVar180._28_4_ = 3;
          auVar204._8_4_ = 2;
          auVar204._0_8_ = 0x200000002;
          auVar204._12_4_ = 2;
          auVar204._16_4_ = 2;
          auVar204._20_4_ = 2;
          auVar204._24_4_ = 2;
          auVar204._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar204,auVar180,auVar14);
          auVar148 = vpcmpgtd_avx(auVar114._16_16_,local_660._0_16_);
          auVar214 = vpshufd_avx(local_5a0._0_16_,0);
          auVar214 = vpcmpgtd_avx(auVar114._0_16_,auVar214);
          auVar181._16_16_ = auVar148;
          auVar181._0_16_ = auVar214;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar214),auVar181,0xf0);
          local_600 = vandnps_avx(_local_8a0,_local_880);
          auVar114 = _local_880 & ~_local_8a0;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            local_7a0 = _local_460;
            local_820._4_4_ = (float)local_460._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = (float)local_460._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = fStack_458 + fStack_998;
            fStack_814 = fStack_454 + fStack_994;
            fStack_810 = fStack_450 + fStack_990;
            fStack_80c = fStack_44c + fStack_98c;
            fStack_808 = fStack_448 + fStack_988;
            fStack_804 = fStack_444 + fStack_984;
            do {
              auVar241 = auVar228._0_16_;
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar114 = vblendvps_avx(auVar182,local_7a0,local_600);
              auVar354 = vshufps_avx(auVar114,auVar114,0xb1);
              auVar354 = vminps_avx(auVar114,auVar354);
              auVar14 = vshufpd_avx(auVar354,auVar354,5);
              auVar354 = vminps_avx(auVar354,auVar14);
              auVar14 = vperm2f128_avx(auVar354,auVar354,1);
              auVar354 = vminps_avx(auVar354,auVar14);
              auVar354 = vcmpps_avx(auVar114,auVar354,0);
              auVar14 = local_600 & auVar354;
              auVar114 = local_600;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar354,local_600);
              }
              uVar96 = vmovmskps_avx(auVar114);
              uVar11 = 0;
              if (uVar96 != 0) {
                for (; (uVar96 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar95 = (ulong)uVar11;
              *(undefined4 *)(local_600 + uVar95 * 4) = 0;
              fVar229 = local_520[uVar95];
              uVar11 = *(uint *)(local_440 + uVar95 * 4);
              fVar230 = local_b08;
              if ((float)local_940._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_940._0_4_);
                auVar241._8_4_ = 0x7fffffff;
                auVar241._0_8_ = 0x7fffffff7fffffff;
                auVar241._12_4_ = 0x7fffffff;
              }
              auVar250 = ZEXT464(uVar11);
              auVar214 = vminps_avx(_local_a80,_local_aa0);
              auVar148 = vmaxps_avx(_local_a80,_local_aa0);
              auVar106 = vminps_avx(_local_a90,_local_ab0);
              auVar192 = vminps_avx(auVar214,auVar106);
              auVar214 = vmaxps_avx(_local_a90,_local_ab0);
              auVar106 = vmaxps_avx(auVar148,auVar214);
              auVar148 = vandps_avx(auVar192,auVar241);
              auVar214 = vandps_avx(auVar106,auVar241);
              auVar148 = vmaxps_avx(auVar148,auVar214);
              auVar214 = vmovshdup_avx(auVar148);
              auVar214 = vmaxss_avx(auVar214,auVar148);
              auVar148 = vshufpd_avx(auVar148,auVar148,1);
              auVar148 = vmaxss_avx(auVar148,auVar214);
              local_a40._0_4_ = auVar148._0_4_ * 1.9073486e-06;
              local_960._0_4_ = fVar230 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar106,auVar106,0xff);
              lVar97 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar229;
                auVar148 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                fVar230 = auVar148._0_4_;
                fVar231 = auVar148._4_4_;
                fVar232 = auVar148._8_4_;
                fVar233 = auVar148._12_4_;
                auVar148 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar234 = auVar148._0_4_;
                fVar235 = auVar148._4_4_;
                fVar251 = auVar148._8_4_;
                fVar252 = auVar148._12_4_;
                fVar254 = (float)local_a90._0_4_ * fVar230 + (float)local_aa0._0_4_ * fVar234;
                fVar256 = (float)local_a90._4_4_ * fVar231 + (float)local_aa0._4_4_ * fVar235;
                fVar259 = fStack_a88 * fVar232 + fStack_a98 * fVar251;
                fVar262 = fStack_a84 * fVar233 + fStack_a94 * fVar252;
                auVar271._0_4_ =
                     fVar234 * ((float)local_aa0._0_4_ * fVar230 + fVar234 * (float)local_a80._0_4_)
                     + fVar230 * fVar254;
                auVar271._4_4_ =
                     fVar235 * ((float)local_aa0._4_4_ * fVar231 + fVar235 * (float)local_a80._4_4_)
                     + fVar231 * fVar256;
                auVar271._8_4_ =
                     fVar251 * (fStack_a98 * fVar232 + fVar251 * fStack_a78) + fVar232 * fVar259;
                auVar271._12_4_ =
                     fVar252 * (fStack_a94 * fVar233 + fVar252 * fStack_a74) + fVar233 * fVar262;
                auVar215._0_4_ =
                     fVar234 * fVar254 +
                     fVar230 * (fVar230 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar234)
                ;
                auVar215._4_4_ =
                     fVar235 * fVar256 +
                     fVar231 * (fVar231 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar235)
                ;
                auVar215._8_4_ =
                     fVar251 * fVar259 + fVar232 * (fVar232 * fStack_aa8 + fStack_a88 * fVar251);
                auVar215._12_4_ =
                     fVar252 * fVar262 + fVar233 * (fVar233 * fStack_aa4 + fStack_a84 * fVar252);
                auVar148 = vshufps_avx(auVar250._0_16_,auVar250._0_16_,0);
                auVar156._0_4_ = auVar148._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar156._4_4_ = auVar148._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar156._8_4_ = auVar148._8_4_ * fStack_928 + 0.0;
                auVar156._12_4_ = auVar148._12_4_ * fStack_924 + 0.0;
                auVar110._0_4_ = fVar234 * auVar271._0_4_ + fVar230 * auVar215._0_4_;
                auVar110._4_4_ = fVar235 * auVar271._4_4_ + fVar231 * auVar215._4_4_;
                auVar110._8_4_ = fVar251 * auVar271._8_4_ + fVar232 * auVar215._8_4_;
                auVar110._12_4_ = fVar252 * auVar271._12_4_ + fVar233 * auVar215._12_4_;
                local_8e0._0_16_ = auVar110;
                auVar148 = vsubps_avx(auVar156,auVar110);
                _local_9c0 = auVar148;
                auVar148 = vdpps_avx(auVar148,auVar148,0x7f);
                fVar230 = auVar148._0_4_;
                local_bc0 = auVar250._0_4_;
                if (fVar230 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ae0._0_16_ = auVar271;
                  local_a20._0_16_ = auVar215;
                  fVar231 = sqrtf(fVar230);
                  auVar215 = local_a20._0_16_;
                  auVar271 = local_ae0._0_16_;
                }
                else {
                  auVar214 = vsqrtss_avx(auVar148,auVar148);
                  fVar231 = auVar214._0_4_;
                }
                auVar214 = vsubps_avx(auVar215,auVar271);
                auVar301._0_4_ = auVar214._0_4_ * 3.0;
                auVar301._4_4_ = auVar214._4_4_ * 3.0;
                auVar301._8_4_ = auVar214._8_4_ * 3.0;
                auVar301._12_4_ = auVar214._12_4_ * 3.0;
                auVar214 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0))
                                       ,0);
                auVar106 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar229 + fVar229)) * 6.0));
                auVar192 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar229 -
                                          ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0))
                ;
                auVar211 = vshufps_avx(auVar106,auVar106,0);
                auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                     ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar106 = vdpps_avx(auVar301,auVar301,0x7f);
                auVar157._0_4_ =
                     auVar3._0_4_ * (float)local_a80._0_4_ +
                     auVar211._0_4_ * (float)local_aa0._0_4_ +
                     auVar214._0_4_ * (float)local_ab0._0_4_ +
                     auVar192._0_4_ * (float)local_a90._0_4_;
                auVar157._4_4_ =
                     auVar3._4_4_ * (float)local_a80._4_4_ +
                     auVar211._4_4_ * (float)local_aa0._4_4_ +
                     auVar214._4_4_ * (float)local_ab0._4_4_ +
                     auVar192._4_4_ * (float)local_a90._4_4_;
                auVar157._8_4_ =
                     auVar3._8_4_ * fStack_a78 +
                     auVar211._8_4_ * fStack_a98 +
                     auVar214._8_4_ * fStack_aa8 + auVar192._8_4_ * fStack_a88;
                auVar157._12_4_ =
                     auVar3._12_4_ * fStack_a74 +
                     auVar211._12_4_ * fStack_a94 +
                     auVar214._12_4_ * fStack_aa4 + auVar192._12_4_ * fStack_a84;
                auVar214 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
                auVar192 = vrsqrtss_avx(auVar214,auVar214);
                fVar233 = auVar192._0_4_;
                fVar232 = auVar106._0_4_;
                auVar192 = vdpps_avx(auVar301,auVar157,0x7f);
                auVar211 = vshufps_avx(auVar106,auVar106,0);
                auVar158._0_4_ = auVar157._0_4_ * auVar211._0_4_;
                auVar158._4_4_ = auVar157._4_4_ * auVar211._4_4_;
                auVar158._8_4_ = auVar157._8_4_ * auVar211._8_4_;
                auVar158._12_4_ = auVar157._12_4_ * auVar211._12_4_;
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                auVar242._0_4_ = auVar301._0_4_ * auVar192._0_4_;
                auVar242._4_4_ = auVar301._4_4_ * auVar192._4_4_;
                auVar242._8_4_ = auVar301._8_4_ * auVar192._8_4_;
                auVar242._12_4_ = auVar301._12_4_ * auVar192._12_4_;
                auVar3 = vsubps_avx(auVar158,auVar242);
                auVar192 = vrcpss_avx(auVar214,auVar214);
                auVar214 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_960._0_4_)));
                auVar192 = ZEXT416((uint)(auVar192._0_4_ * (2.0 - fVar232 * auVar192._0_4_)));
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                uVar95 = CONCAT44(auVar301._4_4_,auVar301._0_4_);
                auVar272._0_8_ = uVar95 ^ 0x8000000080000000;
                auVar272._8_4_ = -auVar301._8_4_;
                auVar272._12_4_ = -auVar301._12_4_;
                auVar211 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar232 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar211 = vshufps_avx(auVar211,auVar211,0);
                auVar216._0_4_ = auVar211._0_4_ * auVar3._0_4_ * auVar192._0_4_;
                auVar216._4_4_ = auVar211._4_4_ * auVar3._4_4_ * auVar192._4_4_;
                auVar216._8_4_ = auVar211._8_4_ * auVar3._8_4_ * auVar192._8_4_;
                auVar216._12_4_ = auVar211._12_4_ * auVar3._12_4_ * auVar192._12_4_;
                auVar351._0_4_ = auVar301._0_4_ * auVar211._0_4_;
                auVar351._4_4_ = auVar301._4_4_ * auVar211._4_4_;
                auVar351._8_4_ = auVar301._8_4_ * auVar211._8_4_;
                auVar351._12_4_ = auVar301._12_4_ * auVar211._12_4_;
                local_b00._0_16_ = auVar301;
                local_ae0._0_4_ = auVar214._0_4_;
                if (fVar232 < 0.0) {
                  local_a20._0_4_ = fVar231;
                  local_900._0_16_ = auVar272;
                  local_9e0._0_16_ = auVar351;
                  local_980._0_16_ = auVar216;
                  fVar233 = sqrtf(fVar232);
                  auVar216 = local_980._0_16_;
                  auVar272 = local_900._0_16_;
                  auVar351 = local_9e0._0_16_;
                  fVar232 = (float)local_ae0._0_4_;
                  fVar231 = (float)local_a20._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar233 = auVar106._0_4_;
                  fVar232 = auVar214._0_4_;
                }
                auVar214 = vdpps_avx(_local_9c0,auVar351,0x7f);
                fVar231 = ((float)local_a40._0_4_ / fVar233) * (fVar231 + 1.0) +
                          fVar232 + fVar231 * (float)local_a40._0_4_;
                auVar106 = vdpps_avx(auVar272,auVar351,0x7f);
                auVar192 = vdpps_avx(_local_9c0,auVar216,0x7f);
                auVar211 = vdpps_avx(_local_930,auVar351,0x7f);
                auVar3 = vdpps_avx(_local_9c0,auVar272,0x7f);
                fVar233 = auVar106._0_4_ + auVar192._0_4_;
                fVar234 = auVar214._0_4_;
                auVar111._0_4_ = fVar234 * fVar234;
                auVar111._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                auVar111._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                auVar111._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                auVar192 = vsubps_avx(auVar148,auVar111);
                auVar106 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar235 = auVar3._0_4_ - fVar234 * fVar233;
                fVar251 = auVar106._0_4_ - fVar234 * auVar211._0_4_;
                auVar106 = vrsqrtss_avx(auVar192,auVar192);
                fVar252 = auVar192._0_4_;
                fVar234 = auVar106._0_4_;
                fVar234 = fVar234 * 1.5 + fVar252 * -0.5 * fVar234 * fVar234 * fVar234;
                if (fVar252 < 0.0) {
                  local_a20._0_16_ = auVar214;
                  local_900._0_4_ = fVar231;
                  local_9e0._0_16_ = ZEXT416((uint)fVar233);
                  local_980._0_16_ = auVar211;
                  local_920._0_4_ = fVar235;
                  local_740._0_4_ = fVar251;
                  local_760._0_4_ = fVar234;
                  fVar252 = sqrtf(fVar252);
                  fVar231 = (float)local_900._0_4_;
                  fVar234 = (float)local_760._0_4_;
                  fVar235 = (float)local_920._0_4_;
                  fVar251 = (float)local_740._0_4_;
                  auVar211 = local_980._0_16_;
                  auVar214 = local_a20._0_16_;
                  auVar106 = local_9e0._0_16_;
                  fVar232 = (float)local_ae0._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar192,auVar192);
                  fVar252 = auVar106._0_4_;
                  auVar106 = ZEXT416((uint)fVar233);
                }
                auVar386 = ZEXT1664(local_b00._0_16_);
                auVar159 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar152 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar233 = fVar235 * fVar234 - auVar152._0_4_;
                auVar243._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
                auVar243._8_4_ = auVar211._8_4_ ^ 0x80000000;
                auVar243._12_4_ = auVar211._12_4_ ^ 0x80000000;
                auVar273._0_4_ = -fVar233;
                auVar273._4_4_ = 0x80000000;
                auVar273._8_4_ = 0x80000000;
                auVar273._12_4_ = 0x80000000;
                auVar192 = vinsertps_avx(ZEXT416((uint)(fVar251 * fVar234)),auVar243,0x10);
                auVar3 = vmovsldup_avx(ZEXT416((uint)(auVar106._0_4_ * fVar251 * fVar234 -
                                                     auVar211._0_4_ * fVar233)));
                auVar192 = vdivps_avx(auVar192,auVar3);
                auVar159 = ZEXT416((uint)(fVar252 - auVar159._0_4_));
                auVar211 = vinsertps_avx(auVar214,auVar159,0x10);
                auVar217._0_4_ = auVar211._0_4_ * auVar192._0_4_;
                auVar217._4_4_ = auVar211._4_4_ * auVar192._4_4_;
                auVar217._8_4_ = auVar211._8_4_ * auVar192._8_4_;
                auVar217._12_4_ = auVar211._12_4_ * auVar192._12_4_;
                auVar106 = vinsertps_avx(auVar273,auVar106,0x1c);
                auVar106 = vdivps_avx(auVar106,auVar3);
                auVar196._0_4_ = auVar211._0_4_ * auVar106._0_4_;
                auVar196._4_4_ = auVar211._4_4_ * auVar106._4_4_;
                auVar196._8_4_ = auVar211._8_4_ * auVar106._8_4_;
                auVar196._12_4_ = auVar211._12_4_ * auVar106._12_4_;
                auVar106 = vhaddps_avx(auVar217,auVar217);
                auVar192 = vhaddps_avx(auVar196,auVar196);
                fVar229 = fVar229 - auVar106._0_4_;
                local_bc0 = local_bc0 - auVar192._0_4_;
                auVar250 = ZEXT464((uint)local_bc0);
                auVar244._8_4_ = 0x7fffffff;
                auVar244._0_8_ = 0x7fffffff7fffffff;
                auVar244._12_4_ = 0x7fffffff;
                auVar228 = ZEXT1664(auVar244);
                auVar214 = vandps_avx(auVar214,auVar244);
                if (fVar231 <= auVar214._0_4_) {
LAB_010c09ad:
                  bVar75 = false;
                }
                else {
                  auVar214 = vandps_avx(auVar159,auVar244);
                  if ((float)local_780._0_4_ * 1.9073486e-06 + fVar232 + fVar231 <= auVar214._0_4_)
                  goto LAB_010c09ad;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar250 = ZEXT464((uint)local_bc0);
                  bVar75 = true;
                  if ((((fVar208 <= local_bc0) &&
                       (fVar231 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar231)) &&
                      (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                    auVar148 = vrsqrtss_avx(auVar148,auVar148);
                    fVar232 = auVar148._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar8].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar148 = ZEXT416((uint)(fVar232 * 1.5 +
                                               fVar230 * -0.5 * fVar232 * fVar232 * fVar232));
                      auVar148 = vshufps_avx(auVar148,auVar148,0);
                      auVar160._0_4_ = auVar148._0_4_ * (float)local_9c0._0_4_;
                      auVar160._4_4_ = auVar148._4_4_ * (float)local_9c0._4_4_;
                      auVar160._8_4_ = auVar148._8_4_ * fStack_9b8;
                      auVar160._12_4_ = auVar148._12_4_ * fStack_9b4;
                      auVar112._0_4_ = local_b00._0_4_ + auVar152._0_4_ * auVar160._0_4_;
                      auVar112._4_4_ = local_b00._4_4_ + auVar152._4_4_ * auVar160._4_4_;
                      auVar112._8_4_ = local_b00._8_4_ + auVar152._8_4_ * auVar160._8_4_;
                      auVar112._12_4_ = local_b00._12_4_ + auVar152._12_4_ * auVar160._12_4_;
                      auVar148 = vshufps_avx(auVar160,auVar160,0xc9);
                      auVar214 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar161._0_4_ = auVar214._0_4_ * auVar160._0_4_;
                      auVar161._4_4_ = auVar214._4_4_ * auVar160._4_4_;
                      auVar161._8_4_ = auVar214._8_4_ * auVar160._8_4_;
                      auVar161._12_4_ = auVar214._12_4_ * auVar160._12_4_;
                      auVar197._0_4_ = local_b00._0_4_ * auVar148._0_4_;
                      auVar197._4_4_ = local_b00._4_4_ * auVar148._4_4_;
                      auVar197._8_4_ = local_b00._8_4_ * auVar148._8_4_;
                      auVar197._12_4_ = local_b00._12_4_ * auVar148._12_4_;
                      auVar106 = vsubps_avx(auVar197,auVar161);
                      auVar148 = vshufps_avx(auVar106,auVar106,0xc9);
                      auVar214 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar198._0_4_ = auVar214._0_4_ * auVar148._0_4_;
                      auVar198._4_4_ = auVar214._4_4_ * auVar148._4_4_;
                      auVar198._8_4_ = auVar214._8_4_ * auVar148._8_4_;
                      auVar198._12_4_ = auVar214._12_4_ * auVar148._12_4_;
                      auVar148 = vshufps_avx(auVar106,auVar106,0xd2);
                      auVar113._0_4_ = auVar112._0_4_ * auVar148._0_4_;
                      auVar113._4_4_ = auVar112._4_4_ * auVar148._4_4_;
                      auVar113._8_4_ = auVar112._8_4_ * auVar148._8_4_;
                      auVar113._12_4_ = auVar112._12_4_ * auVar148._12_4_;
                      auVar148 = vsubps_avx(auVar198,auVar113);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar148,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar148,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar148._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar229;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(uint *)(ray + k * 4 + 0x110) = uVar94;
                        *(uint *)(ray + k * 4 + 0x120) = uVar8;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar148,auVar148,0x55);
                        auVar214 = vshufps_avx(auVar148,auVar148,0xaa);
                        local_6e0 = vshufps_avx(auVar148,auVar148,0);
                        auStack_6f0 = auVar214;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar11 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar11,uVar11);
                        _uStack_688 = CONCAT44(uVar11,uVar11);
                        uVar11 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar11,uVar11);
                        _uStack_678 = CONCAT44(uVar11,uVar11);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9f0;
                        uStack_b18 = local_9f0[1];
                        local_a70.valid = (int *)&local_b20;
                        local_a70.geometryUserPtr = pGVar9->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_700;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar386 = ZEXT1664(local_b00._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_a70);
                        }
                        auVar89._8_8_ = uStack_b18;
                        auVar89._0_8_ = local_b20;
                        if (auVar89 == (undefined1  [16])0x0) {
                          auVar148 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar148 = auVar148 ^ _DAT_01febe20;
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar386 = ZEXT1664(auVar386._0_16_);
                            (*p_Var10)(&local_a70);
                            auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar90._8_8_ = uStack_b18;
                          auVar90._0_8_ = local_b20;
                          auVar106 = vpcmpeqd_avx(auVar90,_DAT_01feba10);
                          auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                          auVar148 = auVar106 ^ auVar214;
                          if (auVar90 != (undefined1  [16])0x0) {
                            auVar106 = auVar106 ^ auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar214;
                            auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar214;
                          }
                        }
                        auVar250 = ZEXT464((uint)local_bc0);
                        auVar162._8_8_ = 0x100000001;
                        auVar162._0_8_ = 0x100000001;
                        if ((auVar162 & auVar148) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar231;
                        }
                      }
                    }
                  }
                }
                auVar114 = local_600;
                bVar99 = lVar97 != 0;
                lVar97 = lVar97 + -1;
              } while ((!bVar75) && (bVar99));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar126._4_4_ = uVar1;
              auVar126._0_4_ = uVar1;
              auVar126._8_4_ = uVar1;
              auVar126._12_4_ = uVar1;
              auVar126._16_4_ = uVar1;
              auVar126._20_4_ = uVar1;
              auVar126._24_4_ = uVar1;
              auVar126._28_4_ = uVar1;
              auVar354 = vcmpps_avx(_local_820,auVar126,2);
              local_600 = vandps_avx(auVar354,local_600);
              auVar114 = auVar114 & auVar354;
              uVar95 = local_620._0_8_;
            } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar114 >> 0x7f,0) != '\0') ||
                       (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0xbf,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar114[0x1f] < '\0');
          }
          auVar114 = vandps_avx(local_560,local_540);
          auVar354 = vandps_avx(_local_8a0,_local_880);
          auVar311 = ZEXT3264(_local_9a0);
          auVar205._0_4_ = local_9a0._0_4_ + local_4a0._0_4_;
          auVar205._4_4_ = local_9a0._4_4_ + local_4a0._4_4_;
          auVar205._8_4_ = local_9a0._8_4_ + local_4a0._8_4_;
          auVar205._12_4_ = local_9a0._12_4_ + local_4a0._12_4_;
          auVar205._16_4_ = local_9a0._16_4_ + local_4a0._16_4_;
          auVar205._20_4_ = local_9a0._20_4_ + local_4a0._20_4_;
          auVar205._24_4_ = local_9a0._24_4_ + local_4a0._24_4_;
          auVar205._28_4_ = local_9a0._28_4_ + local_4a0._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar248._4_4_ = uVar1;
          auVar248._0_4_ = uVar1;
          auVar248._8_4_ = uVar1;
          auVar248._12_4_ = uVar1;
          auVar248._16_4_ = uVar1;
          auVar248._20_4_ = uVar1;
          auVar248._24_4_ = uVar1;
          auVar248._28_4_ = uVar1;
          auVar14 = vcmpps_avx(auVar205,auVar248,2);
          auVar114 = vandps_avx(auVar14,auVar114);
          auVar282._0_4_ = local_9a0._0_4_ + local_460._0_4_;
          auVar282._4_4_ = local_9a0._4_4_ + local_460._4_4_;
          auVar282._8_4_ = local_9a0._8_4_ + local_460._8_4_;
          auVar282._12_4_ = local_9a0._12_4_ + local_460._12_4_;
          auVar282._16_4_ = local_9a0._16_4_ + local_460._16_4_;
          auVar282._20_4_ = local_9a0._20_4_ + local_460._20_4_;
          auVar282._24_4_ = local_9a0._24_4_ + local_460._24_4_;
          auVar282._28_4_ = local_9a0._28_4_ + local_460._28_4_;
          auVar14 = vcmpps_avx(auVar282,auVar248,2);
          auVar354 = vandps_avx(auVar14,auVar354);
          auVar354 = vorps_avx(auVar114,auVar354);
          if ((((((((auVar354 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar354 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar354 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar354 >> 0x7f,0) == '\0') &&
                (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar354 >> 0xbf,0) == '\0') &&
              (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar354[0x1f]) {
            auVar249._8_4_ = 0x3f800000;
            auVar249._0_8_ = &DAT_3f8000003f800000;
            auVar249._12_4_ = 0x3f800000;
            auVar249._16_4_ = 0x3f800000;
            auVar249._20_4_ = 0x3f800000;
            auVar249._24_4_ = 0x3f800000;
            auVar249._28_4_ = 0x3f800000;
            goto LAB_010befb8;
          }
          *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar354;
          auVar114 = vblendvps_avx(_local_460,_local_4a0,auVar114);
          *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar114;
          uVar2 = vmovlps_avx(auVar325);
          *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar2;
          auStack_138[uVar93 * 0x18] = (int)uVar95 + 1;
          uVar93 = (ulong)((int)uVar93 + 1);
        }
        auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    auVar338 = ZEXT1664(auVar325);
    do {
      if ((int)uVar93 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar127._4_4_ = uVar1;
        auVar127._0_4_ = uVar1;
        auVar127._8_4_ = uVar1;
        auVar127._12_4_ = uVar1;
        auVar127._16_4_ = uVar1;
        auVar127._20_4_ = uVar1;
        auVar127._24_4_ = uVar1;
        auVar127._28_4_ = uVar1;
        auVar114 = vcmpps_avx(local_3e0,auVar127,2);
        uVar94 = vmovmskps_avx(auVar114);
        uVar94 = (uint)local_8a8 & uVar94;
        if (uVar94 == 0) {
          return;
        }
        goto LAB_010be2dd;
      }
      uVar98 = (ulong)((int)uVar93 - 1);
      lVar97 = uVar98 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar97);
      auVar122._0_4_ = auVar311._0_4_ + auVar114._0_4_;
      auVar122._4_4_ = auVar311._4_4_ + auVar114._4_4_;
      auVar122._8_4_ = auVar311._8_4_ + auVar114._8_4_;
      auVar122._12_4_ = auVar311._12_4_ + auVar114._12_4_;
      auVar122._16_4_ = auVar311._16_4_ + auVar114._16_4_;
      auVar122._20_4_ = auVar311._20_4_ + auVar114._20_4_;
      auVar122._24_4_ = auVar311._24_4_ + auVar114._24_4_;
      auVar122._28_4_ = auVar311._28_4_ + auVar114._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar227._4_4_ = uVar1;
      auVar227._0_4_ = uVar1;
      auVar227._8_4_ = uVar1;
      auVar227._12_4_ = uVar1;
      auVar227._16_4_ = uVar1;
      auVar227._20_4_ = uVar1;
      auVar227._24_4_ = uVar1;
      auVar227._28_4_ = uVar1;
      auVar14 = vcmpps_avx(auVar122,auVar227,2);
      auVar354 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar97));
      _local_700 = auVar354;
      auVar15 = *(undefined1 (*) [32])(auStack_180 + lVar97) & auVar14;
      bVar81 = (auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar82 = (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = SUB321(auVar15 >> 0x7f,0) == '\0';
      bVar78 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar15 >> 0xbf,0) == '\0';
      bVar99 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = -1 < auVar15[0x1f];
      if (((((((!bVar81 || !bVar82) || !bVar80) || !bVar79) || !bVar78) || !bVar77) || !bVar99) ||
          !bVar75) {
        auVar201._8_4_ = 0x7f800000;
        auVar201._0_8_ = 0x7f8000007f800000;
        auVar201._12_4_ = 0x7f800000;
        auVar201._16_4_ = 0x7f800000;
        auVar201._20_4_ = 0x7f800000;
        auVar201._24_4_ = 0x7f800000;
        auVar201._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar201,auVar114,auVar354);
        auVar14 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar14 = vminps_avx(auVar114,auVar14);
        auVar15 = vshufpd_avx(auVar14,auVar14,5);
        auVar15 = vminps_avx(auVar14,auVar15);
        auVar14 = vperm2f128_avx(auVar15,auVar15,1);
        auVar15 = vminps_avx(auVar15,auVar14);
        auVar114 = vcmpps_avx(auVar114,auVar15,0);
        auVar15 = auVar354 & auVar114;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar354 = vandps_avx(auVar114,auVar354);
        }
        fVar229 = afStack_140[uVar98 * 0x18 + 1];
        uVar95 = (ulong)auStack_138[uVar98 * 0x18];
        uVar96 = vmovmskps_avx(auVar354);
        uVar11 = 0;
        if (uVar96 != 0) {
          for (; (uVar96 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        fVar230 = afStack_140[uVar98 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar11 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar98 = uVar93;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar97) = _local_700;
        auVar148 = vshufps_avx(ZEXT416((uint)(fVar229 - fVar230)),ZEXT416((uint)(fVar229 - fVar230))
                               ,0);
        local_4a0._4_4_ = fVar230 + auVar148._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar230 + auVar148._0_4_ * 0.0;
        fStack_498 = fVar230 + auVar148._8_4_ * 0.2857143;
        fStack_494 = fVar230 + auVar148._12_4_ * 0.42857146;
        fStack_490 = fVar230 + auVar148._0_4_ * 0.5714286;
        fStack_48c = fVar230 + auVar148._4_4_ * 0.71428573;
        fStack_488 = fVar230 + auVar148._8_4_ * 0.8571429;
        fStack_484 = fVar230 + auVar148._12_4_;
        auVar338 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar11 * 4));
      }
      uVar93 = uVar98;
      auVar228 = ZEXT3264(auVar14);
    } while (((((((bVar81 && bVar82) && bVar80) && bVar79) && bVar78) && bVar77) && bVar99) &&
             bVar75);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }